

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<4,4>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive PVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 (*pauVar68) [32];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  int iVar73;
  ulong uVar74;
  long lVar75;
  ulong uVar76;
  float fVar77;
  undefined8 uVar79;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar80 [16];
  float fVar112;
  float fVar114;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar92 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar93 [16];
  undefined1 auVar109 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [60];
  undefined1 auVar111 [64];
  float fVar115;
  undefined8 extraout_XMM1_Qa;
  float fVar139;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 extraout_var_01 [56];
  undefined1 auVar136 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar184;
  float fVar185;
  vint4 ai_2;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar186;
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [28];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  vint4 bi;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar234;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  vint4 ai_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [64];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar247;
  undefined1 auVar246 [64];
  float fVar248;
  float fVar253;
  float fVar254;
  undefined1 auVar249 [16];
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  float fVar268;
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  undefined1 auVar273 [28];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c48;
  uint uStack_b64;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 (*local_a48) [16];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  undefined4 local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined4 uStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  Primitive *local_8f0;
  Primitive *local_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  uint local_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [16];
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_570 [16];
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar135 [64];
  undefined1 auVar137 [64];
  undefined1 auVar250 [16];
  
  PVar1 = prim[1];
  uVar76 = (ulong)(byte)PVar1;
  lVar75 = uVar76 * 0x19;
  fVar77 = *(float *)(prim + lVar75 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + lVar75 + 6));
  auVar80._0_4_ = fVar77 * auVar5._0_4_;
  auVar80._4_4_ = fVar77 * auVar5._4_4_;
  auVar80._8_4_ = fVar77 * auVar5._8_4_;
  auVar80._12_4_ = fVar77 * auVar5._12_4_;
  auVar207._0_4_ = fVar77 * auVar6._0_4_;
  auVar207._4_4_ = fVar77 * auVar6._4_4_;
  auVar207._8_4_ = fVar77 * auVar6._8_4_;
  auVar207._12_4_ = fVar77 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar76 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar74 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar76 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar74 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar148 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar148 = vcvtdq2ps_avx(auVar148);
  auVar267 = ZEXT1664(auVar148);
  auVar269._4_4_ = auVar207._0_4_;
  auVar269._0_4_ = auVar207._0_4_;
  auVar269._8_4_ = auVar207._0_4_;
  auVar269._12_4_ = auVar207._0_4_;
  auVar117 = vshufps_avx(auVar207,auVar207,0x55);
  auVar81 = vshufps_avx(auVar207,auVar207,0xaa);
  fVar77 = auVar81._0_4_;
  auVar249._0_4_ = fVar77 * auVar7._0_4_;
  fVar112 = auVar81._4_4_;
  auVar249._4_4_ = fVar112 * auVar7._4_4_;
  fVar113 = auVar81._8_4_;
  auVar249._8_4_ = fVar113 * auVar7._8_4_;
  fVar114 = auVar81._12_4_;
  auVar249._12_4_ = fVar114 * auVar7._12_4_;
  auVar243._0_4_ = auVar9._0_4_ * fVar77;
  auVar243._4_4_ = auVar9._4_4_ * fVar112;
  auVar243._8_4_ = auVar9._8_4_ * fVar113;
  auVar243._12_4_ = auVar9._12_4_ * fVar114;
  auVar235._0_4_ = auVar148._0_4_ * fVar77;
  auVar235._4_4_ = auVar148._4_4_ * fVar112;
  auVar235._8_4_ = auVar148._8_4_ * fVar113;
  auVar235._12_4_ = auVar148._12_4_ * fVar114;
  auVar81 = vfmadd231ps_fma(auVar249,auVar117,auVar6);
  auVar118 = vfmadd231ps_fma(auVar243,auVar117,auVar167);
  auVar117 = vfmadd231ps_fma(auVar235,auVar82,auVar117);
  auVar89 = vfmadd231ps_fma(auVar81,auVar269,auVar5);
  auVar118 = vfmadd231ps_fma(auVar118,auVar269,auVar8);
  auVar191 = vfmadd231ps_fma(auVar117,auVar83,auVar269);
  auVar270._4_4_ = auVar80._0_4_;
  auVar270._0_4_ = auVar80._0_4_;
  auVar270._8_4_ = auVar80._0_4_;
  auVar270._12_4_ = auVar80._0_4_;
  auVar117 = vshufps_avx(auVar80,auVar80,0x55);
  auVar81 = vshufps_avx(auVar80,auVar80,0xaa);
  fVar77 = auVar81._0_4_;
  auVar208._0_4_ = fVar77 * auVar7._0_4_;
  fVar112 = auVar81._4_4_;
  auVar208._4_4_ = fVar112 * auVar7._4_4_;
  fVar113 = auVar81._8_4_;
  auVar208._8_4_ = fVar113 * auVar7._8_4_;
  fVar114 = auVar81._12_4_;
  auVar208._12_4_ = fVar114 * auVar7._12_4_;
  auVar116._0_4_ = auVar9._0_4_ * fVar77;
  auVar116._4_4_ = auVar9._4_4_ * fVar112;
  auVar116._8_4_ = auVar9._8_4_ * fVar113;
  auVar116._12_4_ = auVar9._12_4_ * fVar114;
  auVar81._0_4_ = auVar148._0_4_ * fVar77;
  auVar81._4_4_ = auVar148._4_4_ * fVar112;
  auVar81._8_4_ = auVar148._8_4_ * fVar113;
  auVar81._12_4_ = auVar148._12_4_ * fVar114;
  auVar6 = vfmadd231ps_fma(auVar208,auVar117,auVar6);
  auVar7 = vfmadd231ps_fma(auVar116,auVar117,auVar167);
  auVar167 = vfmadd231ps_fma(auVar81,auVar117,auVar82);
  auVar9 = vfmadd231ps_fma(auVar6,auVar270,auVar5);
  auVar82 = vfmadd231ps_fma(auVar7,auVar270,auVar8);
  auVar148 = vfmadd231ps_fma(auVar167,auVar270,auVar83);
  auVar226._8_4_ = 0x7fffffff;
  auVar226._0_8_ = 0x7fffffff7fffffff;
  auVar226._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar89,auVar226);
  auVar190._8_4_ = 0x219392ef;
  auVar190._0_8_ = 0x219392ef219392ef;
  auVar190._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar190,1);
  auVar6 = vblendvps_avx(auVar89,auVar190,auVar5);
  auVar5 = vandps_avx(auVar118,auVar226);
  auVar5 = vcmpps_avx(auVar5,auVar190,1);
  auVar7 = vblendvps_avx(auVar118,auVar190,auVar5);
  auVar5 = vandps_avx(auVar191,auVar226);
  auVar5 = vcmpps_avx(auVar5,auVar190,1);
  auVar5 = vblendvps_avx(auVar191,auVar190,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = 0x3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar227);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar227);
  auVar167 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar227);
  auVar83 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar76 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar191._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar191._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar191._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar191._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar76 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar9);
  auVar209._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar209._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar209._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar209._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar118._1_3_ = 0;
  auVar118[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar76 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar82);
  auVar236._0_4_ = auVar5._0_4_ * auVar167._0_4_;
  auVar236._4_4_ = auVar5._4_4_ * auVar167._4_4_;
  auVar236._8_4_ = auVar5._8_4_ * auVar167._8_4_;
  auVar236._12_4_ = auVar5._12_4_ * auVar167._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar82);
  auVar117._0_4_ = auVar167._0_4_ * auVar5._0_4_;
  auVar117._4_4_ = auVar167._4_4_ * auVar5._4_4_;
  auVar117._8_4_ = auVar167._8_4_ * auVar5._8_4_;
  auVar117._12_4_ = auVar167._12_4_ * auVar5._12_4_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar74 + uVar76 + 6);
  auVar5 = vpmovsxwd_avx(auVar167);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar148);
  auVar89._0_4_ = auVar83._0_4_ * auVar5._0_4_;
  auVar89._4_4_ = auVar83._4_4_ * auVar5._4_4_;
  auVar89._8_4_ = auVar83._8_4_ * auVar5._8_4_;
  auVar89._12_4_ = auVar83._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar76 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar148);
  auVar82._0_4_ = auVar83._0_4_ * auVar5._0_4_;
  auVar82._4_4_ = auVar83._4_4_ * auVar5._4_4_;
  auVar82._8_4_ = auVar83._8_4_ * auVar5._8_4_;
  auVar82._12_4_ = auVar83._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar191,auVar209);
  auVar6 = vpminsd_avx(auVar236,auVar117);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar89,auVar82);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar240._4_4_ = uVar78;
  auVar240._0_4_ = uVar78;
  auVar240._8_4_ = uVar78;
  auVar240._12_4_ = uVar78;
  auVar6 = vmaxps_avx(auVar6,auVar240);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_560._0_4_ = auVar5._0_4_ * 0.99999964;
  local_560._4_4_ = auVar5._4_4_ * 0.99999964;
  local_560._8_4_ = auVar5._8_4_ * 0.99999964;
  local_560._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar191,auVar209);
  auVar6 = vpmaxsd_avx(auVar236,auVar117);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar89,auVar82);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar148._4_4_ = uVar78;
  auVar148._0_4_ = uVar78;
  auVar148._8_4_ = uVar78;
  auVar148._12_4_ = uVar78;
  auVar6 = vminps_avx(auVar6,auVar148);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar83._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar83._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar83._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar83._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar118[4] = PVar1;
  auVar118._5_3_ = 0;
  auVar118[8] = PVar1;
  auVar118._9_3_ = 0;
  auVar118[0xc] = PVar1;
  auVar118._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar118,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_560,auVar83,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar69 = vmovmskps_avx(auVar5);
  if (uVar69 == 0) {
    return;
  }
  uVar69 = uVar69 & 0xff;
  local_8f0 = prim + lVar75 + 0x16;
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  local_4e0 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  local_a48 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_8a0 = 0x7fffffff;
  uStack_89c = 0x7fffffff;
  uStack_898 = 0x7fffffff;
  uStack_894 = 0x7fffffff;
  uStack_890 = 0x7fffffff;
  uStack_88c = 0x7fffffff;
  uStack_888 = 0x7fffffff;
  uStack_884 = 0x7fffffff;
  local_660 = 0x80000000;
  uStack_65c = 0x80000000;
  uStack_658 = 0x80000000;
  uStack_654 = 0x80000000;
  fStack_650 = -0.0;
  fStack_64c = -0.0;
  fStack_648 = -0.0;
  uStack_644 = 0x80000000;
  local_8e8 = prim;
LAB_0158af95:
  lVar75 = 0;
  uVar76 = (ulong)uVar69;
  for (uVar74 = uVar76; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    lVar75 = lVar75 + 1;
  }
  uVar76 = uVar76 - 1 & uVar76;
  local_9a0 = *(undefined4 *)(local_8e8 + lVar75 * 4 + 6);
  uVar74 = (ulong)(uint)((int)lVar75 << 6);
  auVar5 = *(undefined1 (*) [16])(local_8f0 + uVar74);
  if (uVar76 != 0) {
    uVar72 = uVar76 - 1 & uVar76;
    for (uVar17 = uVar76; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_8f0 + uVar74 + 0x10);
  auVar7 = *(undefined1 (*) [16])(local_8f0 + uVar74 + 0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar244._4_4_ = uVar78;
  auVar244._0_4_ = uVar78;
  auVar244._8_4_ = uVar78;
  auVar244._12_4_ = uVar78;
  fStack_850 = (float)uVar78;
  _local_860 = auVar244;
  fStack_84c = (float)uVar78;
  fStack_848 = (float)uVar78;
  register0x0000149c = uVar78;
  auVar8 = *(undefined1 (*) [16])(local_8f0 + uVar74 + 0x30);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar250._4_4_ = uVar78;
  auVar250._0_4_ = uVar78;
  auVar250._8_4_ = uVar78;
  auVar250._12_4_ = uVar78;
  fStack_830 = (float)uVar78;
  _local_840 = auVar250;
  fStack_82c = (float)uVar78;
  fStack_828 = (float)uVar78;
  register0x000014dc = uVar78;
  auVar251 = ZEXT3264(_local_840);
  auVar167 = vunpcklps_avx(auVar244,auVar250);
  fVar77 = *(float *)(ray + k * 4 + 0x60);
  auVar259._4_4_ = fVar77;
  auVar259._0_4_ = fVar77;
  auVar259._8_4_ = fVar77;
  auVar259._12_4_ = fVar77;
  fStack_9b0 = fVar77;
  _local_9c0 = auVar259;
  fStack_9ac = fVar77;
  fStack_9a8 = fVar77;
  uStack_9a4 = fVar77;
  local_9d0 = vinsertps_avx(auVar167,auVar259,0x28);
  auVar239 = ZEXT1664(local_9d0);
  auVar210._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar210._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar210._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar210._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar167 = vsubps_avx(auVar210,auVar9);
  auVar167 = vdpps_avx(auVar167,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar242 = ZEXT1664(local_9e0);
  uVar69 = *(uint *)(local_8e8 + 2);
  auVar83 = vrcpss_avx(local_9e0,local_9e0);
  auVar82 = vfnmadd213ss_fma(auVar83,local_9e0,ZEXT416(0x40000000));
  local_360 = auVar167._0_4_ * auVar83._0_4_ * auVar82._0_4_;
  auVar221._4_4_ = local_360;
  auVar221._0_4_ = local_360;
  auVar221._8_4_ = local_360;
  auVar221._12_4_ = local_360;
  fStack_970 = local_360;
  _local_980 = auVar221;
  fStack_96c = local_360;
  fStack_968 = local_360;
  fStack_964 = local_360;
  auVar167 = vfmadd231ps_fma(auVar9,local_9d0,auVar221);
  auVar167 = vblendps_avx(auVar167,_DAT_01f7aa10,8);
  auVar9 = vsubps_avx(auVar5,auVar167);
  auVar83 = vsubps_avx(auVar7,auVar167);
  auVar82 = vsubps_avx(auVar6,auVar167);
  auVar8 = vsubps_avx(auVar8,auVar167);
  auVar5 = vmovshdup_avx(auVar9);
  uVar79 = auVar5._0_8_;
  auVar274._8_8_ = uVar79;
  auVar274._0_8_ = uVar79;
  auVar274._16_8_ = uVar79;
  auVar274._24_8_ = uVar79;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar79 = auVar5._0_8_;
  local_a80._8_8_ = uVar79;
  local_a80._0_8_ = uVar79;
  local_a80._16_8_ = uVar79;
  local_a80._24_8_ = uVar79;
  auVar272 = ZEXT3264(local_a80);
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(auVar82);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar82,auVar82,0xaa);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar6 = vshufps_avx(auVar82,auVar82,0xff);
  uVar79 = auVar6._0_8_;
  auVar228._8_8_ = uVar79;
  auVar228._0_8_ = uVar79;
  auVar228._16_8_ = uVar79;
  auVar228._24_8_ = uVar79;
  auVar5 = vmovshdup_avx(auVar83);
  local_4a0 = auVar5._0_4_;
  fStack_49c = auVar5._4_4_;
  auVar5 = vshufps_avx(auVar83,auVar83,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar83,auVar83,0xff);
  local_4c0 = auVar5._0_4_;
  fStack_4bc = auVar5._4_4_;
  auVar5 = vmovshdup_avx(auVar8);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_280 = auVar5._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_2a0 = auVar5._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar77 * fVar77)),_local_840,_local_840);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_860,_local_860);
  uVar78 = auVar5._0_4_;
  local_2c0._4_4_ = uVar78;
  local_2c0._0_4_ = uVar78;
  local_2c0._8_4_ = uVar78;
  local_2c0._12_4_ = uVar78;
  local_2c0._16_4_ = uVar78;
  local_2c0._20_4_ = uVar78;
  local_2c0._24_4_ = uVar78;
  local_2c0._28_4_ = uVar78;
  auVar246 = ZEXT3264(local_2c0);
  fVar77 = *(float *)(ray + k * 4 + 0x30);
  local_910 = ZEXT416((uint)local_360);
  local_360 = fVar77 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_c48 = 1;
  uVar74 = 0;
  uVar78 = auVar9._0_4_;
  local_320._4_4_ = uVar78;
  local_320._0_4_ = uVar78;
  local_320._8_4_ = uVar78;
  local_320._12_4_ = uVar78;
  local_320._16_4_ = uVar78;
  local_320._20_4_ = uVar78;
  local_320._24_4_ = uVar78;
  local_320._28_4_ = uVar78;
  fVar112 = auVar82._0_4_;
  local_340._4_4_ = fVar112;
  local_340._0_4_ = fVar112;
  local_340._8_4_ = fVar112;
  local_340._12_4_ = fVar112;
  local_340._16_4_ = fVar112;
  local_340._20_4_ = fVar112;
  local_340._24_4_ = fVar112;
  local_340._28_4_ = fVar112;
  fVar113 = auVar83._0_4_;
  local_2e0 = fVar113;
  fStack_2dc = fVar113;
  fStack_2d8 = fVar113;
  fStack_2d4 = fVar113;
  fStack_2d0 = fVar113;
  fStack_2cc = fVar113;
  fStack_2c8 = fVar113;
  fStack_2c4 = fVar113;
  fVar114 = auVar8._0_4_;
  local_300 = fVar114;
  fStack_2fc = fVar114;
  fStack_2f8 = fVar114;
  fStack_2f4 = fVar114;
  fStack_2f0 = fVar114;
  fStack_2ec = fVar114;
  fStack_2e8 = fVar114;
  fStack_2e4 = fVar114;
  auVar98._4_4_ = uStack_89c;
  auVar98._0_4_ = local_8a0;
  auVar98._8_4_ = uStack_898;
  auVar98._12_4_ = uStack_894;
  auVar98._16_4_ = uStack_890;
  auVar98._20_4_ = uStack_88c;
  auVar98._24_4_ = uStack_888;
  auVar98._28_4_ = uStack_884;
  local_520 = vandps_avx(local_2c0,auVar98);
  auVar5 = vsqrtss_avx(local_9e0,local_9e0);
  auVar7 = vsqrtss_avx(local_9e0,local_9e0);
  local_550 = ZEXT816(0x3f80000000000000);
  local_500 = auVar274;
  local_760 = local_9a0;
  uStack_75c = local_9a0;
  uStack_758 = local_9a0;
  uStack_754 = local_9a0;
  local_750 = uVar69;
  uStack_74c = uVar69;
  uStack_748 = uVar69;
  uStack_744 = uVar69;
  fStack_4b8 = local_4c0;
  fStack_4b4 = fStack_4bc;
  fStack_4b0 = local_4c0;
  fStack_4ac = fStack_4bc;
  fStack_4a8 = local_4c0;
  fStack_4a4 = fStack_4bc;
  fStack_498 = local_4a0;
  fStack_494 = fStack_49c;
  fStack_490 = local_4a0;
  fStack_48c = fStack_49c;
  fStack_488 = local_4a0;
  fStack_484 = fStack_49c;
  do {
    auVar174._8_4_ = 0x3f800000;
    auVar174._0_8_ = 0x3f8000003f800000;
    auVar174._12_4_ = 0x3f800000;
    auVar174._16_4_ = 0x3f800000;
    auVar174._20_4_ = 0x3f800000;
    iVar73 = (int)uVar74;
    auVar174._24_4_ = 0x3f800000;
    auVar174._28_4_ = 0x3f800000;
    auVar167 = vmovshdup_avx(local_550);
    auVar167 = vsubps_avx(auVar167,local_550);
    fVar142 = auVar167._0_4_;
    fVar146 = fVar142 * 0.04761905;
    local_7c0._0_4_ = local_550._0_4_;
    local_7c0._4_4_ = local_7c0._0_4_;
    local_7c0._8_4_ = local_7c0._0_4_;
    local_7c0._12_4_ = local_7c0._0_4_;
    local_7c0._16_4_ = local_7c0._0_4_;
    local_7c0._20_4_ = local_7c0._0_4_;
    local_7c0._24_4_ = local_7c0._0_4_;
    local_7c0._28_4_ = local_7c0._0_4_;
    local_7e0._4_4_ = fVar142;
    local_7e0._0_4_ = fVar142;
    local_7e0._8_4_ = fVar142;
    local_7e0._12_4_ = fVar142;
    local_7e0._16_4_ = fVar142;
    local_7e0._20_4_ = fVar142;
    local_7e0._24_4_ = fVar142;
    local_7e0._28_4_ = fVar142;
    auVar167 = vfmadd231ps_fma(local_7c0,local_7e0,_DAT_01faff20);
    auVar95 = vsubps_avx(auVar174,ZEXT1632(auVar167));
    fVar115 = auVar167._0_4_;
    auVar252._0_4_ = local_340._0_4_ * fVar115;
    fVar138 = auVar167._4_4_;
    auVar252._4_4_ = local_340._4_4_ * fVar138;
    fVar139 = auVar167._8_4_;
    auVar252._8_4_ = local_340._8_4_ * fVar139;
    fVar140 = auVar167._12_4_;
    auVar252._12_4_ = local_340._12_4_ * fVar140;
    auVar252._16_4_ = local_340._16_4_ * 0.0;
    auVar252._20_4_ = local_340._20_4_ * 0.0;
    auVar252._28_36_ = auVar251._28_36_;
    auVar252._24_4_ = local_340._24_4_ * 0.0;
    auVar64._8_8_ = uStack_1f8;
    auVar64._0_8_ = local_200;
    auVar64._16_8_ = uStack_1f0;
    auVar64._24_8_ = uStack_1e8;
    auVar251._0_4_ = (float)local_200 * fVar115;
    auVar251._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar138;
    auVar251._8_4_ = (float)uStack_1f8 * fVar139;
    auVar251._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar140;
    auVar251._16_4_ = (float)uStack_1f0 * 0.0;
    auVar251._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar251._28_36_ = auVar246._28_36_;
    auVar251._24_4_ = (float)uStack_1e8 * 0.0;
    auVar63._8_8_ = uStack_218;
    auVar63._0_8_ = local_220;
    auVar63._16_8_ = uStack_210;
    auVar63._24_8_ = uStack_208;
    auVar246._0_4_ = (float)local_220 * fVar115;
    auVar246._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar138;
    auVar246._8_4_ = (float)uStack_218 * fVar139;
    auVar246._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar140;
    auVar246._16_4_ = (float)uStack_210 * 0.0;
    auVar246._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar246._28_36_ = auVar242._28_36_;
    auVar246._24_4_ = (float)uStack_208 * 0.0;
    fVar144 = auVar6._0_4_;
    fVar141 = auVar6._4_4_;
    auVar154._4_4_ = fVar141 * fVar138;
    auVar154._0_4_ = fVar144 * fVar115;
    auVar154._8_4_ = fVar144 * fVar139;
    auVar154._12_4_ = fVar141 * fVar140;
    auVar154._16_4_ = fVar144 * 0.0;
    auVar154._20_4_ = fVar141 * 0.0;
    auVar154._24_4_ = fVar144 * 0.0;
    auVar154._28_4_ = fVar142;
    auVar167 = vfmadd231ps_fma(auVar252._0_32_,auVar95,local_320);
    auVar148 = vfmadd231ps_fma(auVar251._0_32_,auVar95,auVar274);
    auVar117 = vfmadd231ps_fma(auVar246._0_32_,auVar95,auVar272._0_32_);
    auVar65._8_8_ = uStack_1d8;
    auVar65._0_8_ = local_1e0;
    auVar65._16_8_ = uStack_1d0;
    auVar65._24_8_ = uStack_1c8;
    auVar81 = vfmadd231ps_fma(auVar154,auVar95,auVar65);
    auVar61._4_4_ = fStack_2dc;
    auVar61._0_4_ = local_2e0;
    auVar61._8_4_ = fStack_2d8;
    auVar61._12_4_ = fStack_2d4;
    auVar61._16_4_ = fStack_2d0;
    auVar61._20_4_ = fStack_2cc;
    auVar61._24_4_ = fStack_2c8;
    auVar61._28_4_ = fStack_2c4;
    auVar242._0_4_ = local_2e0 * fVar115;
    auVar242._4_4_ = fStack_2dc * fVar138;
    auVar242._8_4_ = fStack_2d8 * fVar139;
    auVar242._12_4_ = fStack_2d4 * fVar140;
    auVar242._16_4_ = fStack_2d0 * 0.0;
    auVar242._20_4_ = fStack_2cc * 0.0;
    auVar242._28_36_ = auVar239._28_36_;
    auVar242._24_4_ = fStack_2c8 * 0.0;
    auVar11._4_4_ = fVar138 * fStack_49c;
    auVar11._0_4_ = fVar115 * local_4a0;
    auVar11._8_4_ = fVar139 * fStack_498;
    auVar11._12_4_ = fVar140 * fStack_494;
    auVar11._16_4_ = fStack_490 * 0.0;
    auVar11._20_4_ = fStack_48c * 0.0;
    auVar11._24_4_ = fStack_488 * 0.0;
    auVar11._28_4_ = local_320._28_4_;
    auVar62._8_8_ = uStack_238;
    auVar62._0_8_ = local_240;
    auVar62._16_8_ = uStack_230;
    auVar62._24_8_ = uStack_228;
    auVar66._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar138;
    auVar66._0_4_ = (float)local_240 * fVar115;
    auVar66._8_4_ = (float)uStack_238 * fVar139;
    auVar66._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar140;
    auVar66._16_4_ = (float)uStack_230 * 0.0;
    auVar66._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar66._24_4_ = (float)uStack_228 * 0.0;
    auVar66._28_4_ = DAT_01faff20._28_4_;
    auVar179._4_4_ = fVar138 * fStack_4bc;
    auVar179._0_4_ = fVar115 * local_4c0;
    auVar179._8_4_ = fVar139 * fStack_4b8;
    auVar179._12_4_ = fVar140 * fStack_4b4;
    auVar179._16_4_ = fStack_4b0 * 0.0;
    auVar179._20_4_ = fStack_4ac * 0.0;
    uVar78 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar179._24_4_ = fStack_4a8 * 0.0;
    auVar179._28_4_ = uVar78;
    auVar118 = vfmadd231ps_fma(auVar242._0_32_,auVar95,local_340);
    auVar89 = vfmadd231ps_fma(auVar11,auVar95,auVar64);
    auVar191 = vfmadd231ps_fma(auVar66,auVar95,auVar63);
    auVar80 = vfmadd231ps_fma(auVar179,auVar95,auVar228);
    auVar239._0_4_ = fVar115 * local_300;
    auVar239._4_4_ = fVar138 * fStack_2fc;
    auVar239._8_4_ = fVar139 * fStack_2f8;
    auVar239._12_4_ = fVar140 * fStack_2f4;
    auVar239._16_4_ = fStack_2f0 * 0.0;
    auVar239._20_4_ = fStack_2ec * 0.0;
    auVar239._28_36_ = auVar267._28_36_;
    auVar239._24_4_ = fStack_2e8 * 0.0;
    auVar12._4_4_ = fVar138 * local_260._4_4_;
    auVar12._0_4_ = fVar115 * (float)local_260;
    auVar12._8_4_ = fVar139 * (float)uStack_258;
    auVar12._12_4_ = fVar140 * uStack_258._4_4_;
    auVar12._16_4_ = (float)uStack_250 * 0.0;
    auVar12._20_4_ = uStack_250._4_4_ * 0.0;
    auVar12._24_4_ = (float)uStack_248 * 0.0;
    auVar12._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar67._28_4_ = fVar141;
    auVar67._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar140,
                            CONCAT48(auVar118._8_4_ * fVar139,
                                     CONCAT44(auVar118._4_4_ * fVar138,auVar118._0_4_ * fVar115))));
    auVar167 = vfmadd231ps_fma(auVar67,auVar95,ZEXT1632(auVar167));
    auVar148 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar89._12_4_,
                                                  CONCAT48(fVar139 * auVar89._8_4_,
                                                           CONCAT44(fVar138 * auVar89._4_4_,
                                                                    fVar115 * auVar89._0_4_)))),
                               auVar95,ZEXT1632(auVar148));
    auVar117 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar191._12_4_,
                                                  CONCAT48(fVar139 * auVar191._8_4_,
                                                           CONCAT44(fVar138 * auVar191._4_4_,
                                                                    fVar115 * auVar191._0_4_)))),
                               auVar95,ZEXT1632(auVar117));
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar80._12_4_,
                                                 CONCAT48(fVar139 * auVar80._8_4_,
                                                          CONCAT44(fVar138 * auVar80._4_4_,
                                                                   fVar115 * auVar80._0_4_)))),
                              auVar95,ZEXT1632(auVar81));
    auVar13._4_4_ = fVar138 * local_280._4_4_;
    auVar13._0_4_ = fVar115 * (float)local_280;
    auVar13._8_4_ = fVar139 * (float)uStack_278;
    auVar13._12_4_ = fVar140 * uStack_278._4_4_;
    auVar13._16_4_ = (float)uStack_270 * 0.0;
    auVar13._20_4_ = uStack_270._4_4_ * 0.0;
    auVar13._24_4_ = (float)uStack_268 * 0.0;
    auVar13._28_4_ = local_340._28_4_;
    auVar116 = vfmadd231ps_fma(auVar239._0_32_,auVar95,auVar61);
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * fVar140,
                                                  CONCAT48(auVar116._8_4_ * fVar139,
                                                           CONCAT44(auVar116._4_4_ * fVar138,
                                                                    auVar116._0_4_ * fVar115)))),
                               auVar95,ZEXT1632(auVar118));
    auVar237._0_4_ = fVar115 * (float)local_2a0;
    auVar237._4_4_ = fVar138 * local_2a0._4_4_;
    auVar237._8_4_ = fVar139 * (float)uStack_298;
    auVar237._12_4_ = fVar140 * uStack_298._4_4_;
    auVar237._16_4_ = (float)uStack_290 * 0.0;
    auVar237._20_4_ = uStack_290._4_4_ * 0.0;
    auVar237._24_4_ = (float)uStack_288 * 0.0;
    auVar237._28_4_ = 0;
    auVar175._4_4_ = fStack_49c;
    auVar175._0_4_ = local_4a0;
    auVar175._8_4_ = fStack_498;
    auVar175._12_4_ = fStack_494;
    auVar175._16_4_ = fStack_490;
    auVar175._20_4_ = fStack_48c;
    auVar175._24_4_ = fStack_488;
    auVar175._28_4_ = fStack_484;
    auVar116 = vfmadd231ps_fma(auVar12,auVar95,auVar175);
    auVar190 = vfmadd231ps_fma(auVar13,auVar95,auVar62);
    auVar96._4_4_ = fStack_4bc;
    auVar96._0_4_ = local_4c0;
    auVar96._8_4_ = fStack_4b8;
    auVar96._12_4_ = fStack_4b4;
    auVar96._16_4_ = fStack_4b0;
    auVar96._20_4_ = fStack_4ac;
    auVar96._24_4_ = fStack_4a8;
    auVar96._28_4_ = fStack_4a4;
    auVar207 = vfmadd231ps_fma(auVar237,auVar95,auVar96);
    auVar178._28_4_ = uVar78;
    auVar178._0_28_ =
         ZEXT1628(CONCAT412(auVar207._12_4_ * fVar140,
                            CONCAT48(auVar207._8_4_ * fVar139,
                                     CONCAT44(auVar207._4_4_ * fVar138,auVar207._0_4_ * fVar115))));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * fVar140,
                                                 CONCAT48(auVar116._8_4_ * fVar139,
                                                          CONCAT44(auVar116._4_4_ * fVar138,
                                                                   auVar116._0_4_ * fVar115)))),
                              auVar95,ZEXT1632(auVar89));
    auVar191 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar190._12_4_,
                                                  CONCAT48(fVar139 * auVar190._8_4_,
                                                           CONCAT44(fVar138 * auVar190._4_4_,
                                                                    fVar115 * auVar190._0_4_)))),
                               auVar95,ZEXT1632(auVar191));
    auVar80 = vfmadd231ps_fma(auVar178,auVar95,ZEXT1632(auVar80));
    auVar14._28_4_ = fStack_2c4;
    auVar14._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * fVar140,
                            CONCAT48(auVar89._8_4_ * fVar139,
                                     CONCAT44(auVar89._4_4_ * fVar138,auVar89._0_4_ * fVar115))));
    auVar15._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(fVar140 * auVar191._12_4_,
                            CONCAT48(fVar139 * auVar191._8_4_,
                                     CONCAT44(fVar138 * auVar191._4_4_,fVar115 * auVar191._0_4_))));
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar118._12_4_ * fVar140,
                                                  CONCAT48(auVar118._8_4_ * fVar139,
                                                           CONCAT44(auVar118._4_4_ * fVar138,
                                                                    auVar118._0_4_ * fVar115)))),
                               auVar95,ZEXT1632(auVar167));
    auVar190 = vfmadd231ps_fma(auVar14,auVar95,ZEXT1632(auVar148));
    auVar96 = ZEXT1632(auVar190);
    auVar190 = vfmadd231ps_fma(auVar15,auVar95,ZEXT1632(auVar117));
    auVar207 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar80._12_4_ * fVar140,
                                                  CONCAT48(auVar80._8_4_ * fVar139,
                                                           CONCAT44(auVar80._4_4_ * fVar138,
                                                                    auVar80._0_4_ * fVar115)))),
                               ZEXT1632(auVar81),auVar95);
    auVar274 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar167));
    auVar95 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar148));
    auVar98 = vsubps_avx(ZEXT1632(auVar191),ZEXT1632(auVar117));
    auVar154 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar81));
    local_aa0._0_4_ = fVar146 * auVar274._0_4_ * 3.0;
    local_aa0._4_4_ = fVar146 * auVar274._4_4_ * 3.0;
    local_aa0._8_4_ = fVar146 * auVar274._8_4_ * 3.0;
    local_aa0._12_4_ = fVar146 * auVar274._12_4_ * 3.0;
    local_aa0._16_4_ = fVar146 * auVar274._16_4_ * 3.0;
    local_aa0._20_4_ = fVar146 * auVar274._20_4_ * 3.0;
    local_aa0._24_4_ = fVar146 * auVar274._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    local_780._0_4_ = fVar146 * auVar95._0_4_ * 3.0;
    local_780._4_4_ = fVar146 * auVar95._4_4_ * 3.0;
    local_780._8_4_ = fVar146 * auVar95._8_4_ * 3.0;
    local_780._12_4_ = fVar146 * auVar95._12_4_ * 3.0;
    local_780._16_4_ = fVar146 * auVar95._16_4_ * 3.0;
    local_780._20_4_ = fVar146 * auVar95._20_4_ * 3.0;
    local_780._24_4_ = fVar146 * auVar95._24_4_ * 3.0;
    local_780._28_4_ = 0;
    auVar260._0_4_ = fVar146 * auVar98._0_4_ * 3.0;
    auVar260._4_4_ = fVar146 * auVar98._4_4_ * 3.0;
    auVar260._8_4_ = fVar146 * auVar98._8_4_ * 3.0;
    auVar260._12_4_ = fVar146 * auVar98._12_4_ * 3.0;
    auVar260._16_4_ = fVar146 * auVar98._16_4_ * 3.0;
    auVar260._20_4_ = fVar146 * auVar98._20_4_ * 3.0;
    auVar260._24_4_ = fVar146 * auVar98._24_4_ * 3.0;
    auVar260._28_4_ = 0;
    fVar115 = fVar146 * auVar154._0_4_ * 3.0;
    fVar138 = fVar146 * auVar154._4_4_ * 3.0;
    auVar99._4_4_ = fVar138;
    auVar99._0_4_ = fVar115;
    fVar139 = fVar146 * auVar154._8_4_ * 3.0;
    auVar99._8_4_ = fVar139;
    fVar140 = fVar146 * auVar154._12_4_ * 3.0;
    auVar99._12_4_ = fVar140;
    fVar142 = fVar146 * auVar154._16_4_ * 3.0;
    auVar99._16_4_ = fVar142;
    fVar144 = fVar146 * auVar154._20_4_ * 3.0;
    auVar99._20_4_ = fVar144;
    fVar146 = fVar146 * auVar154._24_4_ * 3.0;
    auVar99._24_4_ = fVar146;
    auVar99._28_4_ = auVar274._28_4_;
    auVar175 = ZEXT1632(auVar116);
    auVar12 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar116));
    auVar13 = vpermps_avx2(_DAT_01fec480,auVar96);
    _local_960 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar190));
    _local_6a0 = vsubps_avx(auVar12,auVar175);
    local_5e0 = vsubps_avx(_local_960,ZEXT1632(auVar190));
    fVar141 = local_5e0._0_4_;
    fVar143 = local_5e0._4_4_;
    auVar203._4_4_ = fVar143 * local_aa0._4_4_;
    auVar203._0_4_ = fVar141 * local_aa0._0_4_;
    fVar145 = local_5e0._8_4_;
    auVar203._8_4_ = fVar145 * local_aa0._8_4_;
    fVar147 = local_5e0._12_4_;
    auVar203._12_4_ = fVar147 * local_aa0._12_4_;
    fVar268 = local_5e0._16_4_;
    auVar203._16_4_ = fVar268 * local_aa0._16_4_;
    fVar234 = local_5e0._20_4_;
    auVar203._20_4_ = fVar234 * local_aa0._20_4_;
    fVar160 = local_5e0._24_4_;
    auVar203._24_4_ = fVar160 * local_aa0._24_4_;
    auVar203._28_4_ = auVar12._28_4_;
    auVar167 = vfmsub231ps_fma(auVar203,auVar260,_local_6a0);
    local_600 = vsubps_avx(auVar13,auVar96);
    fVar184 = local_6a0._0_4_;
    fVar185 = local_6a0._4_4_;
    auVar10._4_4_ = fVar185 * local_780._4_4_;
    auVar10._0_4_ = fVar184 * local_780._0_4_;
    fVar186 = local_6a0._8_4_;
    auVar10._8_4_ = fVar186 * local_780._8_4_;
    fVar187 = local_6a0._12_4_;
    auVar10._12_4_ = fVar187 * local_780._12_4_;
    fVar188 = local_6a0._16_4_;
    auVar10._16_4_ = fVar188 * local_780._16_4_;
    fVar189 = local_6a0._20_4_;
    auVar10._20_4_ = fVar189 * local_780._20_4_;
    fVar247 = local_6a0._24_4_;
    auVar10._24_4_ = fVar247 * local_780._24_4_;
    auVar10._28_4_ = auVar13._28_4_;
    auVar148 = vfmsub231ps_fma(auVar10,local_aa0,local_600);
    auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar148._12_4_ * auVar148._12_4_,
                                                  CONCAT48(auVar148._8_4_ * auVar148._8_4_,
                                                           CONCAT44(auVar148._4_4_ * auVar148._4_4_,
                                                                    auVar148._0_4_ * auVar148._0_4_)
                                                          ))),ZEXT1632(auVar167),ZEXT1632(auVar167))
    ;
    fVar248 = local_600._0_4_;
    fVar253 = local_600._4_4_;
    auVar18._4_4_ = fVar253 * auVar260._4_4_;
    auVar18._0_4_ = fVar248 * auVar260._0_4_;
    fVar254 = local_600._8_4_;
    auVar18._8_4_ = fVar254 * auVar260._8_4_;
    fVar255 = local_600._12_4_;
    auVar18._12_4_ = fVar255 * auVar260._12_4_;
    fVar256 = local_600._16_4_;
    auVar18._16_4_ = fVar256 * auVar260._16_4_;
    fVar257 = local_600._20_4_;
    auVar18._20_4_ = fVar257 * auVar260._20_4_;
    fVar258 = local_600._24_4_;
    auVar18._24_4_ = fVar258 * auVar260._24_4_;
    auVar18._28_4_ = local_960._28_4_;
    auVar117 = vfmsub231ps_fma(auVar18,local_780,local_5e0);
    auVar153._0_4_ = fVar141 * fVar141;
    auVar153._4_4_ = fVar143 * fVar143;
    auVar153._8_4_ = fVar145 * fVar145;
    auVar153._12_4_ = fVar147 * fVar147;
    auVar153._16_4_ = fVar268 * fVar268;
    auVar153._20_4_ = fVar234 * fVar234;
    auVar153._24_4_ = fVar160 * fVar160;
    auVar153._28_4_ = 0;
    auVar148 = vfmadd231ps_fma(auVar153,local_600,local_600);
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),_local_6a0,_local_6a0);
    auVar95 = vrcpps_avx(ZEXT1632(auVar148));
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar167),ZEXT1632(auVar117),ZEXT1632(auVar117));
    auVar263._8_4_ = 0x3f800000;
    auVar263._0_8_ = 0x3f8000003f800000;
    auVar263._12_4_ = 0x3f800000;
    auVar263._16_4_ = 0x3f800000;
    auVar263._20_4_ = 0x3f800000;
    auVar263._24_4_ = 0x3f800000;
    auVar263._28_4_ = 0x3f800000;
    auVar167 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar148),auVar263);
    auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar95,auVar95);
    auVar178 = vpermps_avx2(_DAT_01fec480,local_aa0);
    local_a20 = vpermps_avx2(_DAT_01fec480,auVar260);
    auVar19._4_4_ = auVar178._4_4_ * fVar143;
    auVar19._0_4_ = auVar178._0_4_ * fVar141;
    auVar19._8_4_ = auVar178._8_4_ * fVar145;
    auVar19._12_4_ = auVar178._12_4_ * fVar147;
    auVar19._16_4_ = auVar178._16_4_ * fVar268;
    auVar19._20_4_ = auVar178._20_4_ * fVar234;
    auVar19._24_4_ = auVar178._24_4_ * fVar160;
    auVar19._28_4_ = auVar95._28_4_;
    auVar81 = vfmsub231ps_fma(auVar19,local_a20,_local_6a0);
    local_a40 = vpermps_avx2(_DAT_01fec480,local_780);
    auVar20._4_4_ = fVar185 * local_a40._4_4_;
    auVar20._0_4_ = fVar184 * local_a40._0_4_;
    auVar20._8_4_ = fVar186 * local_a40._8_4_;
    auVar20._12_4_ = fVar187 * local_a40._12_4_;
    auVar20._16_4_ = fVar188 * local_a40._16_4_;
    auVar20._20_4_ = fVar189 * local_a40._20_4_;
    auVar20._24_4_ = fVar247 * local_a40._24_4_;
    auVar20._28_4_ = 0;
    auVar118 = vfmsub231ps_fma(auVar20,auVar178,local_600);
    auVar81 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                                 CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                                          CONCAT44(auVar118._4_4_ * auVar118._4_4_,
                                                                   auVar118._0_4_ * auVar118._0_4_))
                                                )),ZEXT1632(auVar81),ZEXT1632(auVar81));
    auVar215._0_4_ = fVar248 * local_a20._0_4_;
    auVar215._4_4_ = fVar253 * local_a20._4_4_;
    auVar215._8_4_ = fVar254 * local_a20._8_4_;
    auVar215._12_4_ = fVar255 * local_a20._12_4_;
    auVar215._16_4_ = fVar256 * local_a20._16_4_;
    auVar215._20_4_ = fVar257 * local_a20._20_4_;
    auVar215._24_4_ = fVar258 * local_a20._24_4_;
    auVar215._28_4_ = 0;
    auVar118 = vfmsub231ps_fma(auVar215,local_a40,local_5e0);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),ZEXT1632(auVar118),ZEXT1632(auVar118));
    auVar95 = vmaxps_avx(ZEXT1632(CONCAT412(auVar117._12_4_ * auVar167._12_4_,
                                            CONCAT48(auVar117._8_4_ * auVar167._8_4_,
                                                     CONCAT44(auVar117._4_4_ * auVar167._4_4_,
                                                              auVar117._0_4_ * auVar167._0_4_)))),
                         ZEXT1632(CONCAT412(auVar81._12_4_ * auVar167._12_4_,
                                            CONCAT48(auVar81._8_4_ * auVar167._8_4_,
                                                     CONCAT44(auVar81._4_4_ * auVar167._4_4_,
                                                              auVar81._0_4_ * auVar167._0_4_)))));
    auVar176._0_4_ = auVar207._0_4_ + fVar115;
    auVar176._4_4_ = auVar207._4_4_ + fVar138;
    auVar176._8_4_ = auVar207._8_4_ + fVar139;
    auVar176._12_4_ = auVar207._12_4_ + fVar140;
    auVar176._16_4_ = fVar142 + 0.0;
    auVar176._20_4_ = fVar144 + 0.0;
    auVar176._24_4_ = fVar146 + 0.0;
    auVar176._28_4_ = auVar274._28_4_ + 0.0;
    auStack_810 = auVar176._16_16_;
    local_800 = ZEXT1632(auVar207);
    auVar274 = vsubps_avx(local_800,auVar99);
    auVar14 = vpermps_avx2(_DAT_01fec480,auVar274);
    auVar15 = vpermps_avx2(_DAT_01fec480,local_800);
    auVar274 = vmaxps_avx(local_800,auVar176);
    auVar98 = vmaxps_avx(auVar14,auVar15);
    auVar154 = vrsqrtps_avx(ZEXT1632(auVar148));
    auVar274 = vmaxps_avx(auVar274,auVar98);
    fVar115 = auVar154._0_4_;
    fVar138 = auVar154._4_4_;
    fVar139 = auVar154._8_4_;
    fVar140 = auVar154._12_4_;
    fVar146 = auVar154._16_4_;
    fVar142 = auVar154._20_4_;
    fVar144 = auVar154._24_4_;
    auVar21._4_4_ = fVar138 * fVar138 * fVar138 * auVar148._4_4_ * -0.5;
    auVar21._0_4_ = fVar115 * fVar115 * fVar115 * auVar148._0_4_ * -0.5;
    auVar21._8_4_ = fVar139 * fVar139 * fVar139 * auVar148._8_4_ * -0.5;
    auVar21._12_4_ = fVar140 * fVar140 * fVar140 * auVar148._12_4_ * -0.5;
    auVar21._16_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar21._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
    auVar21._24_4_ = fVar144 * fVar144 * fVar144 * -0.0;
    auVar21._28_4_ = auVar98._28_4_;
    auVar97._8_4_ = 0x3fc00000;
    auVar97._0_8_ = 0x3fc000003fc00000;
    auVar97._12_4_ = 0x3fc00000;
    auVar97._16_4_ = 0x3fc00000;
    auVar97._20_4_ = 0x3fc00000;
    auVar97._24_4_ = 0x3fc00000;
    auVar97._28_4_ = 0x3fc00000;
    auVar167 = vfmadd231ps_fma(auVar21,auVar97,auVar154);
    fVar138 = auVar167._0_4_;
    fVar139 = auVar167._4_4_;
    auVar22._4_4_ = fVar253 * fVar139;
    auVar22._0_4_ = fVar248 * fVar138;
    fVar146 = auVar167._8_4_;
    auVar22._8_4_ = fVar254 * fVar146;
    fVar144 = auVar167._12_4_;
    auVar22._12_4_ = fVar255 * fVar144;
    auVar22._16_4_ = fVar256 * 0.0;
    auVar22._20_4_ = fVar257 * 0.0;
    uVar78 = auVar154._28_4_;
    auVar22._24_4_ = fVar258 * 0.0;
    auVar22._28_4_ = uVar78;
    auVar23._4_4_ = (float)local_9c0._4_4_ * fVar143 * fVar139;
    auVar23._0_4_ = (float)local_9c0._0_4_ * fVar141 * fVar138;
    auVar23._8_4_ = fStack_9b8 * fVar145 * fVar146;
    auVar23._12_4_ = fStack_9b4 * fVar147 * fVar144;
    auVar23._16_4_ = fStack_9b0 * fVar268 * 0.0;
    auVar23._20_4_ = fStack_9ac * fVar234 * 0.0;
    auVar23._24_4_ = fStack_9a8 * fVar160 * 0.0;
    auVar23._28_4_ = local_600._28_4_;
    auVar148 = vfmadd231ps_fma(auVar23,auVar22,_local_840);
    local_5c0 = ZEXT1632(auVar190);
    auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
    local_7a0 = vsubps_avx(auVar98,local_5c0);
    fVar248 = local_7a0._0_4_;
    auVar275._0_4_ = fVar248 * fVar141 * fVar138;
    fVar253 = local_7a0._4_4_;
    auVar275._4_4_ = fVar253 * fVar143 * fVar139;
    fVar254 = local_7a0._8_4_;
    auVar275._8_4_ = fVar254 * fVar145 * fVar146;
    fVar255 = local_7a0._12_4_;
    auVar275._12_4_ = fVar255 * fVar147 * fVar144;
    fVar256 = local_7a0._16_4_;
    auVar275._16_4_ = fVar256 * fVar268 * 0.0;
    fVar257 = local_7a0._20_4_;
    auVar275._20_4_ = fVar257 * fVar234 * 0.0;
    fVar258 = local_7a0._24_4_;
    auVar275._24_4_ = fVar258 * fVar160 * 0.0;
    auVar275._28_4_ = 0;
    auVar98 = vsubps_avx(auVar98,auVar96);
    auVar117 = vfmadd231ps_fma(auVar275,auVar98,auVar22);
    auVar24._4_4_ = fVar185 * fVar139;
    auVar24._0_4_ = fVar184 * fVar138;
    auVar24._8_4_ = fVar186 * fVar146;
    auVar24._12_4_ = fVar187 * fVar144;
    auVar24._16_4_ = fVar188 * 0.0;
    auVar24._20_4_ = fVar189 * 0.0;
    auVar24._24_4_ = fVar247 * 0.0;
    auVar24._28_4_ = uVar78;
    auVar148 = vfmadd231ps_fma(ZEXT1632(auVar148),auVar24,_local_860);
    auVar251 = ZEXT1664(auVar148);
    auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar154 = vsubps_avx(auVar99,auVar175);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar154,auVar24);
    auVar25._4_4_ = fVar253 * (float)local_9c0._4_4_;
    auVar25._0_4_ = fVar248 * (float)local_9c0._0_4_;
    auVar25._8_4_ = fVar254 * fStack_9b8;
    auVar25._12_4_ = fVar255 * fStack_9b4;
    auVar25._16_4_ = fVar256 * fStack_9b0;
    auVar25._20_4_ = fVar257 * fStack_9ac;
    auVar25._24_4_ = fVar258 * fStack_9a8;
    auVar25._28_4_ = uVar78;
    auVar81 = vfmadd231ps_fma(auVar25,_local_840,auVar98);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),_local_860,auVar154);
    fVar115 = auVar117._0_4_;
    fVar268 = auVar148._0_4_;
    fVar140 = auVar117._4_4_;
    fVar234 = auVar148._4_4_;
    fVar142 = auVar117._8_4_;
    fVar160 = auVar148._8_4_;
    fVar141 = auVar117._12_4_;
    fVar184 = auVar148._12_4_;
    auVar26._28_4_ = uStack_9a4;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar141,
                            CONCAT48(fVar160 * fVar142,CONCAT44(fVar234 * fVar140,fVar268 * fVar115)
                                    )));
    auVar11 = vsubps_avx(ZEXT1632(auVar81),auVar26);
    auVar27._4_4_ = fVar253 * fVar253;
    auVar27._0_4_ = fVar248 * fVar248;
    auVar27._8_4_ = fVar254 * fVar254;
    auVar27._12_4_ = fVar255 * fVar255;
    auVar27._16_4_ = fVar256 * fVar256;
    auVar27._20_4_ = fVar257 * fVar257;
    auVar27._24_4_ = fVar258 * fVar258;
    auVar27._28_4_ = uStack_9a4;
    auVar81 = vfmadd231ps_fma(auVar27,auVar98,auVar98);
    auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar154,auVar154);
    auVar28._28_4_ = local_6a0._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar141 * fVar141,
                            CONCAT48(fVar142 * fVar142,CONCAT44(fVar140 * fVar140,fVar115 * fVar115)
                                    )));
    auVar179 = vsubps_avx(ZEXT1632(auVar81),auVar28);
    _local_680 = vsqrtps_avx(auVar95);
    fVar115 = (local_680._0_4_ + auVar274._0_4_) * 1.0000002;
    fVar140 = (local_680._4_4_ + auVar274._4_4_) * 1.0000002;
    fVar142 = (local_680._8_4_ + auVar274._8_4_) * 1.0000002;
    fVar141 = (local_680._12_4_ + auVar274._12_4_) * 1.0000002;
    fVar143 = (local_680._16_4_ + auVar274._16_4_) * 1.0000002;
    fVar145 = (local_680._20_4_ + auVar274._20_4_) * 1.0000002;
    fVar147 = (local_680._24_4_ + auVar274._24_4_) * 1.0000002;
    auVar29._4_4_ = fVar140 * fVar140;
    auVar29._0_4_ = fVar115 * fVar115;
    auVar29._8_4_ = fVar142 * fVar142;
    auVar29._12_4_ = fVar141 * fVar141;
    auVar29._16_4_ = fVar143 * fVar143;
    auVar29._20_4_ = fVar145 * fVar145;
    auVar29._24_4_ = fVar147 * fVar147;
    auVar29._28_4_ = local_680._28_4_ + auVar274._28_4_;
    local_640._0_4_ = auVar11._0_4_ + auVar11._0_4_;
    local_640._4_4_ = auVar11._4_4_ + auVar11._4_4_;
    local_640._8_4_ = auVar11._8_4_ + auVar11._8_4_;
    local_640._12_4_ = auVar11._12_4_ + auVar11._12_4_;
    local_640._16_4_ = auVar11._16_4_ + auVar11._16_4_;
    local_640._20_4_ = auVar11._20_4_ + auVar11._20_4_;
    local_640._24_4_ = auVar11._24_4_ + auVar11._24_4_;
    local_640._28_4_ = auVar11._28_4_ + auVar11._28_4_;
    auVar242 = ZEXT3264(local_640);
    auVar274 = vsubps_avx(auVar179,auVar29);
    auVar246 = ZEXT3264(auVar274);
    local_3c0 = ZEXT1632(auVar148);
    local_620._28_4_ = local_7a0._28_4_;
    local_620._0_28_ =
         ZEXT1628(CONCAT412(fVar184 * fVar184,
                            CONCAT48(fVar160 * fVar160,CONCAT44(fVar234 * fVar234,fVar268 * fVar268)
                                    )));
    local_540 = vsubps_avx(local_2c0,local_620);
    auVar239 = ZEXT3264(local_540);
    auVar30._4_4_ = local_640._4_4_ * local_640._4_4_;
    auVar30._0_4_ = local_640._0_4_ * local_640._0_4_;
    auVar30._8_4_ = local_640._8_4_ * local_640._8_4_;
    auVar30._12_4_ = local_640._12_4_ * local_640._12_4_;
    auVar30._16_4_ = local_640._16_4_ * local_640._16_4_;
    auVar30._20_4_ = local_640._20_4_ * local_640._20_4_;
    auVar30._24_4_ = local_640._24_4_ * local_640._24_4_;
    auVar30._28_4_ = 0x3f800002;
    fVar140 = local_540._0_4_;
    fVar142 = local_540._4_4_;
    fStack_99c = fVar142 * 4.0;
    fVar141 = local_540._8_4_;
    fStack_998 = fVar141 * 4.0;
    fVar143 = local_540._12_4_;
    fStack_994 = fVar143 * 4.0;
    fVar145 = local_540._16_4_;
    fStack_990 = fVar145 * 4.0;
    fVar147 = local_540._20_4_;
    fStack_98c = fVar147 * 4.0;
    fVar268 = local_540._24_4_;
    fStack_988 = fVar268 * 4.0;
    uStack_984 = 0x40800000;
    auVar31._4_4_ = auVar274._4_4_ * fStack_99c;
    auVar31._0_4_ = auVar274._0_4_ * fVar140 * 4.0;
    auVar31._8_4_ = auVar274._8_4_ * fStack_998;
    auVar31._12_4_ = auVar274._12_4_ * fStack_994;
    auVar31._16_4_ = auVar274._16_4_ * fStack_990;
    auVar31._20_4_ = auVar274._20_4_ * fStack_98c;
    auVar31._24_4_ = auVar274._24_4_ * fStack_988;
    auVar31._28_4_ = 0x40800000;
    auVar11 = vsubps_avx(auVar30,auVar31);
    auVar95 = vcmpps_avx(auVar11,auVar99,5);
    local_3e0 = ZEXT1632(auVar117);
    fVar115 = local_540._28_4_;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      auVar264._8_4_ = 0x7f800000;
      auVar264._0_8_ = 0x7f8000007f800000;
      auVar264._12_4_ = 0x7f800000;
      auVar264._16_4_ = 0x7f800000;
      auVar264._20_4_ = 0x7f800000;
      auVar264._24_4_ = 0x7f800000;
      auVar264._28_4_ = 0x7f800000;
      auVar199._8_4_ = 0xff800000;
      auVar199._0_8_ = 0xff800000ff800000;
      auVar199._12_4_ = 0xff800000;
      auVar199._16_4_ = 0xff800000;
      auVar199._20_4_ = 0xff800000;
      auVar199._24_4_ = 0xff800000;
      auVar199._28_4_ = 0xff800000;
    }
    else {
      auVar10 = vsqrtps_avx(auVar11);
      auVar100._0_4_ = fVar140 + fVar140;
      auVar100._4_4_ = fVar142 + fVar142;
      auVar100._8_4_ = fVar141 + fVar141;
      auVar100._12_4_ = fVar143 + fVar143;
      auVar100._16_4_ = fVar145 + fVar145;
      auVar100._20_4_ = fVar147 + fVar147;
      auVar100._24_4_ = fVar268 + fVar268;
      auVar100._28_4_ = fVar115 + fVar115;
      auVar203 = vrcpps_avx(auVar100);
      auVar99 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,5);
      auVar200._8_4_ = 0x3f800000;
      auVar200._0_8_ = 0x3f8000003f800000;
      auVar200._12_4_ = 0x3f800000;
      auVar200._16_4_ = 0x3f800000;
      auVar200._20_4_ = 0x3f800000;
      auVar200._24_4_ = 0x3f800000;
      auVar200._28_4_ = 0x3f800000;
      auVar148 = vfnmadd213ps_fma(auVar100,auVar203,auVar200);
      auVar148 = vfmadd132ps_fma(ZEXT1632(auVar148),auVar203,auVar203);
      auVar201._0_4_ = (uint)local_640._0_4_ ^ local_660;
      auVar201._4_4_ = (uint)local_640._4_4_ ^ uStack_65c;
      auVar201._8_4_ = (uint)local_640._8_4_ ^ uStack_658;
      auVar201._12_4_ = (uint)local_640._12_4_ ^ uStack_654;
      auVar201._16_4_ = (uint)local_640._16_4_ ^ (uint)fStack_650;
      auVar201._20_4_ = (uint)local_640._20_4_ ^ (uint)fStack_64c;
      auVar201._24_4_ = (uint)local_640._24_4_ ^ (uint)fStack_648;
      auVar201._28_4_ = (uint)local_640._28_4_ ^ uStack_644;
      auVar203 = vsubps_avx(auVar201,auVar10);
      auVar32._4_4_ = auVar203._4_4_ * auVar148._4_4_;
      auVar32._0_4_ = auVar203._0_4_ * auVar148._0_4_;
      auVar32._8_4_ = auVar203._8_4_ * auVar148._8_4_;
      auVar32._12_4_ = auVar203._12_4_ * auVar148._12_4_;
      auVar32._16_4_ = auVar203._16_4_ * 0.0;
      auVar32._20_4_ = auVar203._20_4_ * 0.0;
      auVar32._24_4_ = auVar203._24_4_ * 0.0;
      auVar32._28_4_ = auVar203._28_4_;
      auVar11 = vsubps_avx(auVar10,local_640);
      auVar101._0_4_ = auVar11._0_4_ * auVar148._0_4_;
      auVar101._4_4_ = auVar11._4_4_ * auVar148._4_4_;
      auVar101._8_4_ = auVar11._8_4_ * auVar148._8_4_;
      auVar101._12_4_ = auVar11._12_4_ * auVar148._12_4_;
      auVar101._16_4_ = auVar11._16_4_ * 0.0;
      auVar101._20_4_ = auVar11._20_4_ * 0.0;
      auVar101._24_4_ = auVar11._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      auVar148 = vfmadd213ps_fma(local_3c0,auVar32,local_3e0);
      local_380 = ZEXT1632(CONCAT412(fVar144 * auVar148._12_4_,
                                     CONCAT48(fVar146 * auVar148._8_4_,
                                              CONCAT44(fVar139 * auVar148._4_4_,
                                                       fVar138 * auVar148._0_4_))));
      auVar54._4_4_ = uStack_89c;
      auVar54._0_4_ = local_8a0;
      auVar54._8_4_ = uStack_898;
      auVar54._12_4_ = uStack_894;
      auVar54._16_4_ = uStack_890;
      auVar54._20_4_ = uStack_88c;
      auVar54._24_4_ = uStack_888;
      auVar54._28_4_ = uStack_884;
      auVar11 = vandps_avx(local_620,auVar54);
      auVar11 = vmaxps_avx(local_520,auVar11);
      auVar33._4_4_ = auVar11._4_4_ * 1.9073486e-06;
      auVar33._0_4_ = auVar11._0_4_ * 1.9073486e-06;
      auVar33._8_4_ = auVar11._8_4_ * 1.9073486e-06;
      auVar33._12_4_ = auVar11._12_4_ * 1.9073486e-06;
      auVar33._16_4_ = auVar11._16_4_ * 1.9073486e-06;
      auVar33._20_4_ = auVar11._20_4_ * 1.9073486e-06;
      auVar33._24_4_ = auVar11._24_4_ * 1.9073486e-06;
      auVar33._28_4_ = auVar11._28_4_;
      auVar11 = vandps_avx(local_540,auVar54);
      auVar11 = vcmpps_avx(auVar11,auVar33,1);
      auVar148 = vfmadd213ps_fma(local_3c0,auVar101,local_3e0);
      auVar229._8_4_ = 0x7f800000;
      auVar229._0_8_ = 0x7f8000007f800000;
      auVar229._12_4_ = 0x7f800000;
      auVar229._16_4_ = 0x7f800000;
      auVar229._20_4_ = 0x7f800000;
      auVar229._24_4_ = 0x7f800000;
      auVar229._28_4_ = 0x7f800000;
      auVar264 = vblendvps_avx(auVar229,auVar32,auVar99);
      local_3a0 = auVar148._0_4_ * fVar138;
      fStack_39c = auVar148._4_4_ * fVar139;
      fStack_398 = auVar148._8_4_ * fVar146;
      fStack_394 = auVar148._12_4_ * fVar144;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = auVar203._28_4_;
      auVar202._8_4_ = 0xff800000;
      auVar202._0_8_ = 0xff800000ff800000;
      auVar202._12_4_ = 0xff800000;
      auVar202._16_4_ = 0xff800000;
      auVar202._20_4_ = 0xff800000;
      auVar202._24_4_ = 0xff800000;
      auVar202._28_4_ = 0xff800000;
      auVar199 = vblendvps_avx(auVar202,auVar101,auVar99);
      auVar203 = auVar99 & auVar11;
      if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar203 >> 0x7f,0) != '\0') ||
            (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar203 >> 0xbf,0) != '\0') ||
          (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar203[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar11,auVar99);
        auVar11 = vcmpps_avx(auVar274,ZEXT832(0) << 0x20,2);
        auVar271._8_4_ = 0xff800000;
        auVar271._0_8_ = 0xff800000ff800000;
        auVar271._12_4_ = 0xff800000;
        auVar271._16_4_ = 0xff800000;
        auVar271._20_4_ = 0xff800000;
        auVar271._24_4_ = 0xff800000;
        auVar271._28_4_ = 0xff800000;
        auVar233._8_4_ = 0x7f800000;
        auVar233._0_8_ = 0x7f8000007f800000;
        auVar233._12_4_ = 0x7f800000;
        auVar233._16_4_ = 0x7f800000;
        auVar233._20_4_ = 0x7f800000;
        auVar233._24_4_ = 0x7f800000;
        auVar233._28_4_ = 0x7f800000;
        auVar274 = vblendvps_avx(auVar233,auVar271,auVar11);
        auVar148 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar203 = vpmovsxwd_avx2(auVar148);
        auVar264 = vblendvps_avx(auVar264,auVar274,auVar203);
        auVar274 = vblendvps_avx(auVar271,auVar233,auVar11);
        auVar246 = ZEXT3264(auVar274);
        auVar199 = vblendvps_avx(auVar199,auVar274,auVar203);
        auVar110._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
        auVar110._8_4_ = auVar95._8_4_ ^ 0xffffffff;
        auVar110._12_4_ = auVar95._12_4_ ^ 0xffffffff;
        auVar110._16_4_ = auVar95._16_4_ ^ 0xffffffff;
        auVar110._20_4_ = auVar95._20_4_ ^ 0xffffffff;
        auVar110._24_4_ = auVar95._24_4_ ^ 0xffffffff;
        auVar110._28_4_ = auVar95._28_4_ ^ 0xffffffff;
        auVar95 = vorps_avx(auVar11,auVar110);
        auVar95 = vandps_avx(auVar99,auVar95);
      }
    }
    auVar267 = ZEXT3264(auVar264);
    auVar274 = local_4e0 & auVar95;
    if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar274 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar274 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar274 >> 0x7f,0) == '\0') &&
          (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar274 >> 0xbf,0) == '\0') &&
        (auVar274 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar274[0x1f])
    {
      auVar272 = ZEXT3264(local_a80);
    }
    else {
      local_400 = ZEXT1632(auVar167);
      fVar234 = *(float *)(ray + k * 4 + 0x80);
      local_570 = ZEXT416((uint)fVar234);
      fVar160 = fVar234 - (float)local_910._0_4_;
      auVar102._4_4_ = fVar160;
      auVar102._0_4_ = fVar160;
      auVar102._8_4_ = fVar160;
      auVar102._12_4_ = fVar160;
      auVar102._16_4_ = fVar160;
      auVar102._20_4_ = fVar160;
      auVar102._24_4_ = fVar160;
      auVar102._28_4_ = fVar160;
      auVar99 = vminps_avx(auVar102,auVar199);
      auVar177._0_4_ = auVar260._0_4_ * fVar248;
      auVar177._4_4_ = auVar260._4_4_ * fVar253;
      auVar177._8_4_ = auVar260._8_4_ * fVar254;
      auVar177._12_4_ = auVar260._12_4_ * fVar255;
      auVar177._16_4_ = auVar260._16_4_ * fVar256;
      auVar177._20_4_ = auVar260._20_4_ * fVar257;
      auVar177._24_4_ = auVar260._24_4_ * fVar258;
      auVar177._28_4_ = 0;
      auVar167 = vfmadd213ps_fma(auVar98,local_780,auVar177);
      auVar60._4_4_ = fStack_35c;
      auVar60._0_4_ = local_360;
      auVar60._8_4_ = fStack_358;
      auVar60._12_4_ = fStack_354;
      auVar60._16_4_ = fStack_350;
      auVar60._20_4_ = fStack_34c;
      auVar60._24_4_ = fStack_348;
      auVar60._28_4_ = fStack_344;
      auVar11 = vmaxps_avx(auVar60,auVar264);
      auVar148 = vfmadd213ps_fma(auVar154,local_aa0,ZEXT1632(auVar167));
      auVar242 = ZEXT3264(_local_9c0);
      auVar34._4_4_ = (float)local_9c0._4_4_ * auVar260._4_4_;
      auVar34._0_4_ = (float)local_9c0._0_4_ * auVar260._0_4_;
      auVar34._8_4_ = fStack_9b8 * auVar260._8_4_;
      auVar34._12_4_ = fStack_9b4 * auVar260._12_4_;
      auVar34._16_4_ = fStack_9b0 * auVar260._16_4_;
      auVar34._20_4_ = fStack_9ac * auVar260._20_4_;
      auVar34._24_4_ = fStack_9a8 * auVar260._24_4_;
      auVar34._28_4_ = 0;
      auVar239 = ZEXT3264(_local_840);
      auVar167 = vfmadd231ps_fma(auVar34,_local_840,local_780);
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar167),_local_860,local_aa0);
      auVar55._4_4_ = uStack_89c;
      auVar55._0_4_ = local_8a0;
      auVar55._8_4_ = uStack_898;
      auVar55._12_4_ = uStack_894;
      auVar55._16_4_ = uStack_890;
      auVar55._20_4_ = uStack_88c;
      auVar55._24_4_ = uStack_888;
      auVar55._28_4_ = uStack_884;
      auVar274 = vandps_avx(auVar55,ZEXT1632(auVar117));
      auVar230._8_4_ = 0x219392ef;
      auVar230._0_8_ = 0x219392ef219392ef;
      auVar230._12_4_ = 0x219392ef;
      auVar230._16_4_ = 0x219392ef;
      auVar230._20_4_ = 0x219392ef;
      auVar230._24_4_ = 0x219392ef;
      auVar230._28_4_ = 0x219392ef;
      auVar98 = vcmpps_avx(auVar274,auVar230,1);
      auVar274 = vrcpps_avx(ZEXT1632(auVar117));
      auVar231._8_4_ = 0x3f800000;
      auVar231._0_8_ = 0x3f8000003f800000;
      auVar231._12_4_ = 0x3f800000;
      auVar231._16_4_ = 0x3f800000;
      auVar231._20_4_ = 0x3f800000;
      auVar231._24_4_ = 0x3f800000;
      auVar231._28_4_ = 0x3f800000;
      auVar203 = ZEXT1632(auVar117);
      auVar167 = vfnmadd213ps_fma(auVar274,auVar203,auVar231);
      auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar274,auVar274);
      auVar261._0_4_ = auVar117._0_4_ ^ local_660;
      auVar261._4_4_ = auVar117._4_4_ ^ uStack_65c;
      auVar261._8_4_ = auVar117._8_4_ ^ uStack_658;
      auVar261._12_4_ = auVar117._12_4_ ^ uStack_654;
      auVar261._16_4_ = fStack_650;
      auVar261._20_4_ = fStack_64c;
      auVar261._24_4_ = fStack_648;
      auVar261._28_4_ = uStack_644;
      auVar35._4_4_ = auVar167._4_4_ * (float)(auVar148._4_4_ ^ uStack_65c);
      auVar35._0_4_ = auVar167._0_4_ * (float)(auVar148._0_4_ ^ local_660);
      auVar35._8_4_ = auVar167._8_4_ * (float)(auVar148._8_4_ ^ uStack_658);
      auVar35._12_4_ = auVar167._12_4_ * (float)(auVar148._12_4_ ^ uStack_654);
      auVar35._16_4_ = fStack_650 * 0.0;
      auVar35._20_4_ = fStack_64c * 0.0;
      auVar35._24_4_ = fStack_648 * 0.0;
      auVar35._28_4_ = uStack_644;
      auVar274 = vcmpps_avx(auVar203,auVar261,1);
      auVar274 = vorps_avx(auVar98,auVar274);
      auVar265._8_4_ = 0xff800000;
      auVar265._0_8_ = 0xff800000ff800000;
      auVar265._12_4_ = 0xff800000;
      auVar265._16_4_ = 0xff800000;
      auVar265._20_4_ = 0xff800000;
      auVar265._24_4_ = 0xff800000;
      auVar265._28_4_ = 0xff800000;
      auVar267 = ZEXT3264(auVar265);
      auVar274 = vblendvps_avx(auVar35,auVar265,auVar274);
      auVar154 = vmaxps_avx(auVar11,auVar274);
      auVar274 = vcmpps_avx(auVar203,auVar261,6);
      auVar274 = vorps_avx(auVar98,auVar274);
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar274 = vblendvps_avx(auVar35,auVar204,auVar274);
      auVar11 = vminps_avx(auVar99,auVar274);
      fVar160 = (float)(local_660 ^ (uint)local_a20._0_4_);
      fVar184 = (float)(uStack_65c ^ (uint)local_a20._4_4_);
      fVar185 = (float)(uStack_658 ^ (uint)local_a20._8_4_);
      fVar186 = (float)(uStack_654 ^ (uint)local_a20._12_4_);
      fVar187 = (float)((uint)fStack_650 ^ (uint)local_a20._16_4_);
      fVar188 = (float)((uint)fStack_64c ^ (uint)local_a20._20_4_);
      fVar189 = (float)((uint)fStack_648 ^ (uint)local_a20._24_4_);
      auVar205._0_4_ = local_660 ^ (uint)local_a40._0_4_;
      auVar205._4_4_ = uStack_65c ^ (uint)local_a40._4_4_;
      auVar205._8_4_ = uStack_658 ^ (uint)local_a40._8_4_;
      auVar205._12_4_ = uStack_654 ^ (uint)local_a40._12_4_;
      auVar205._16_4_ = (uint)fStack_650 ^ (uint)local_a40._16_4_;
      auVar205._20_4_ = (uint)fStack_64c ^ (uint)local_a40._20_4_;
      auVar205._24_4_ = (uint)fStack_648 ^ (uint)local_a40._24_4_;
      auVar205._28_4_ = uStack_644 ^ local_a40._28_4_;
      auVar251 = ZEXT864(0) << 0x20;
      auVar274 = vsubps_avx(ZEXT832(0) << 0x20,auVar13);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,_local_960);
      auVar36._4_4_ = auVar98._4_4_ * fVar184;
      auVar36._0_4_ = auVar98._0_4_ * fVar160;
      auVar36._8_4_ = auVar98._8_4_ * fVar185;
      auVar36._12_4_ = auVar98._12_4_ * fVar186;
      auVar36._16_4_ = auVar98._16_4_ * fVar187;
      auVar36._20_4_ = auVar98._20_4_ * fVar188;
      auVar36._24_4_ = auVar98._24_4_ * fVar189;
      auVar36._28_4_ = auVar98._28_4_;
      auVar167 = vfmadd231ps_fma(auVar36,auVar205,auVar274);
      uStack_b64 = auVar178._28_4_;
      auVar216._0_4_ = local_660 ^ (uint)auVar178._0_4_;
      auVar216._4_4_ = uStack_65c ^ (uint)auVar178._4_4_;
      auVar216._8_4_ = uStack_658 ^ (uint)auVar178._8_4_;
      auVar216._12_4_ = uStack_654 ^ (uint)auVar178._12_4_;
      auVar216._16_4_ = (uint)fStack_650 ^ (uint)auVar178._16_4_;
      auVar216._20_4_ = (uint)fStack_64c ^ (uint)auVar178._20_4_;
      auVar216._24_4_ = (uint)fStack_648 ^ (uint)auVar178._24_4_;
      auVar216._28_4_ = uStack_644 ^ uStack_b64;
      auVar274 = vsubps_avx(ZEXT832(0) << 0x20,auVar12);
      auVar148 = vfmadd231ps_fma(ZEXT1632(auVar167),auVar216,auVar274);
      auVar37._4_4_ = (float)local_9c0._4_4_ * fVar184;
      auVar37._0_4_ = (float)local_9c0._0_4_ * fVar160;
      auVar37._8_4_ = fStack_9b8 * fVar185;
      auVar37._12_4_ = fStack_9b4 * fVar186;
      auVar37._16_4_ = fStack_9b0 * fVar187;
      auVar37._20_4_ = fStack_9ac * fVar188;
      auVar37._24_4_ = fStack_9a8 * fVar189;
      auVar37._28_4_ = uStack_644 ^ local_a20._28_4_;
      auVar167 = vfmadd231ps_fma(auVar37,_local_840,auVar205);
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar167),_local_860,auVar216);
      auVar274 = vandps_avx(auVar55,ZEXT1632(auVar117));
      auVar12 = vrcpps_avx(ZEXT1632(auVar117));
      auVar232._8_4_ = 0x219392ef;
      auVar232._0_8_ = 0x219392ef219392ef;
      auVar232._12_4_ = 0x219392ef;
      auVar232._16_4_ = 0x219392ef;
      auVar232._20_4_ = 0x219392ef;
      auVar232._24_4_ = 0x219392ef;
      auVar232._28_4_ = 0x219392ef;
      auVar98 = vcmpps_avx(auVar274,auVar232,1);
      auVar178 = ZEXT1632(auVar117);
      auVar167 = vfnmadd213ps_fma(auVar12,auVar178,auVar231);
      auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar12,auVar12);
      auVar217._0_4_ = auVar117._0_4_ ^ local_660;
      auVar217._4_4_ = auVar117._4_4_ ^ uStack_65c;
      auVar217._8_4_ = auVar117._8_4_ ^ uStack_658;
      auVar217._12_4_ = auVar117._12_4_ ^ uStack_654;
      auVar217._16_4_ = fStack_650;
      auVar217._20_4_ = fStack_64c;
      auVar217._24_4_ = fStack_648;
      auVar217._28_4_ = uStack_644;
      auVar38._4_4_ = auVar167._4_4_ * (float)(auVar148._4_4_ ^ uStack_65c);
      auVar38._0_4_ = auVar167._0_4_ * (float)(auVar148._0_4_ ^ local_660);
      auVar38._8_4_ = auVar167._8_4_ * (float)(auVar148._8_4_ ^ uStack_658);
      auVar38._12_4_ = auVar167._12_4_ * (float)(auVar148._12_4_ ^ uStack_654);
      auVar38._16_4_ = fStack_650 * 0.0;
      auVar38._20_4_ = fStack_64c * 0.0;
      auVar38._24_4_ = fStack_648 * 0.0;
      auVar38._28_4_ = uStack_644;
      auVar274 = vcmpps_avx(auVar178,auVar217,1);
      auVar274 = vorps_avx(auVar274,auVar98);
      auVar274 = vblendvps_avx(auVar38,auVar265,auVar274);
      auVar246 = ZEXT3264(auVar274);
      _local_ac0 = vmaxps_avx(auVar154,auVar274);
      auVar274 = vcmpps_avx(auVar178,auVar217,6);
      auVar274 = vorps_avx(auVar98,auVar274);
      auVar103._8_4_ = 0x7f800000;
      auVar103._0_8_ = 0x7f8000007f800000;
      auVar103._12_4_ = 0x7f800000;
      auVar103._16_4_ = 0x7f800000;
      auVar103._20_4_ = 0x7f800000;
      auVar103._24_4_ = 0x7f800000;
      auVar103._28_4_ = 0x7f800000;
      auVar274 = vblendvps_avx(auVar38,auVar103,auVar274);
      auVar95 = vandps_avx(auVar95,local_4e0);
      local_420 = vminps_avx(auVar11,auVar274);
      auVar274 = vcmpps_avx(_local_ac0,local_420,2);
      auVar98 = auVar95 & auVar274;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
        auVar272 = ZEXT3264(local_a80);
      }
      else {
        auVar98 = vminps_avx(local_380,auVar231);
        auVar98 = vmaxps_avx(auVar98,ZEXT832(0) << 0x20);
        auVar59._4_4_ = fStack_39c;
        auVar59._0_4_ = local_3a0;
        auVar59._8_4_ = fStack_398;
        auVar59._12_4_ = fStack_394;
        auVar59._16_4_ = uStack_390;
        auVar59._20_4_ = uStack_38c;
        auVar59._24_4_ = uStack_388;
        auVar59._28_4_ = uStack_384;
        auVar154 = vminps_avx(auVar59,auVar231);
        auVar154 = vmaxps_avx(auVar154,ZEXT832(0) << 0x20);
        auVar39._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
        auVar39._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
        auVar39._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
        auVar39._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
        auVar39._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
        auVar39._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
        auVar39._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
        auVar39._28_4_ = auVar98._28_4_ + 7.0;
        auVar267 = ZEXT3264(local_7e0);
        auVar167 = vfmadd213ps_fma(auVar39,local_7e0,local_7c0);
        auVar40._4_4_ = (auVar154._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar154._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar154._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar154._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar154._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar154._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar154._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar154._28_4_ + 7.0;
        auVar148 = vfmadd213ps_fma(auVar40,local_7e0,local_7c0);
        auVar98 = vminps_avx(local_800,auVar176);
        auVar154 = vminps_avx(auVar14,auVar15);
        auVar98 = vminps_avx(auVar98,auVar154);
        auVar98 = vsubps_avx(auVar98,_local_680);
        auVar95 = vandps_avx(auVar274,auVar95);
        local_1a0 = ZEXT1632(auVar167);
        local_1c0 = ZEXT1632(auVar148);
        auVar41._4_4_ = auVar98._4_4_ * 0.99999976;
        auVar41._0_4_ = auVar98._0_4_ * 0.99999976;
        auVar41._8_4_ = auVar98._8_4_ * 0.99999976;
        auVar41._12_4_ = auVar98._12_4_ * 0.99999976;
        auVar41._16_4_ = auVar98._16_4_ * 0.99999976;
        auVar41._20_4_ = auVar98._20_4_ * 0.99999976;
        auVar41._24_4_ = auVar98._24_4_ * 0.99999976;
        auVar41._28_4_ = 0x3f7ffffc;
        auVar274 = vmaxps_avx(ZEXT832(0) << 0x20,auVar41);
        auVar42._4_4_ = auVar274._4_4_ * auVar274._4_4_;
        auVar42._0_4_ = auVar274._0_4_ * auVar274._0_4_;
        auVar42._8_4_ = auVar274._8_4_ * auVar274._8_4_;
        auVar42._12_4_ = auVar274._12_4_ * auVar274._12_4_;
        auVar42._16_4_ = auVar274._16_4_ * auVar274._16_4_;
        auVar42._20_4_ = auVar274._20_4_ * auVar274._20_4_;
        auVar42._24_4_ = auVar274._24_4_ * auVar274._24_4_;
        auVar42._28_4_ = auVar274._28_4_;
        auVar98 = vsubps_avx(auVar179,auVar42);
        auVar246 = ZEXT3264(auVar98);
        auVar43._4_4_ = auVar98._4_4_ * fStack_99c;
        auVar43._0_4_ = auVar98._0_4_ * fVar140 * 4.0;
        auVar43._8_4_ = auVar98._8_4_ * fStack_998;
        auVar43._12_4_ = auVar98._12_4_ * fStack_994;
        auVar43._16_4_ = auVar98._16_4_ * fStack_990;
        auVar43._20_4_ = auVar98._20_4_ * fStack_98c;
        auVar43._24_4_ = auVar98._24_4_ * fStack_988;
        auVar43._28_4_ = auVar274._28_4_;
        auVar274 = vsubps_avx(auVar30,auVar43);
        auVar53 = ZEXT412(0);
        auVar154 = ZEXT1232(auVar53) << 0x20;
        local_8e0 = ZEXT1232(auVar53) << 0x20;
        local_a00 = vcmpps_avx(auVar274,ZEXT832(0) << 0x20,5);
        auVar251 = ZEXT3264(local_a00);
        if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_a00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_a00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_a00 >> 0x7f,0) == '\0') &&
              (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_a00 >> 0xbf,0) == '\0') &&
            (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_a00[0x1f]) {
          _local_680 = ZEXT1232(auVar53) << 0x20;
          auVar179 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar198 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar218._8_4_ = 0x7f800000;
          auVar218._0_8_ = 0x7f8000007f800000;
          auVar218._12_4_ = 0x7f800000;
          auVar218._16_4_ = 0x7f800000;
          auVar218._20_4_ = 0x7f800000;
          auVar218._24_4_ = 0x7f800000;
          auVar218._28_4_ = 0x7f800000;
          auVar224._8_4_ = 0xff800000;
          auVar224._0_8_ = 0xff800000ff800000;
          auVar224._12_4_ = 0xff800000;
          auVar224._16_4_ = 0xff800000;
          auVar224._20_4_ = 0xff800000;
          auVar224._24_4_ = 0xff800000;
          auVar224._28_4_ = 0xff800000;
          local_a00 = auVar13;
          local_8c0 = local_8e0;
        }
        else {
          auVar11 = vsqrtps_avx(auVar274);
          auVar180._0_4_ = fVar140 + fVar140;
          auVar180._4_4_ = fVar142 + fVar142;
          auVar180._8_4_ = fVar141 + fVar141;
          auVar180._12_4_ = fVar143 + fVar143;
          auVar180._16_4_ = fVar145 + fVar145;
          auVar180._20_4_ = fVar147 + fVar147;
          auVar180._24_4_ = fVar268 + fVar268;
          auVar180._28_4_ = fVar115 + fVar115;
          auVar154 = vrcpps_avx(auVar180);
          auVar167 = vfnmadd213ps_fma(auVar180,auVar154,auVar231);
          auVar167 = vfmadd132ps_fma(ZEXT1632(auVar167),auVar154,auVar154);
          auVar206._0_4_ = (uint)local_640._0_4_ ^ local_660;
          auVar206._4_4_ = (uint)local_640._4_4_ ^ uStack_65c;
          auVar206._8_4_ = (uint)local_640._8_4_ ^ uStack_658;
          auVar206._12_4_ = (uint)local_640._12_4_ ^ uStack_654;
          auVar206._16_4_ = (uint)local_640._16_4_ ^ (uint)fStack_650;
          auVar206._20_4_ = (uint)local_640._20_4_ ^ (uint)fStack_64c;
          auVar206._24_4_ = (uint)local_640._24_4_ ^ (uint)fStack_648;
          auVar206._28_4_ = (uint)local_640._28_4_ ^ uStack_644;
          auVar154 = vsubps_avx(auVar206,auVar11);
          auVar11 = vsubps_avx(auVar11,local_640);
          fVar268 = auVar154._0_4_ * auVar167._0_4_;
          fVar160 = auVar154._4_4_ * auVar167._4_4_;
          auVar44._4_4_ = fVar160;
          auVar44._0_4_ = fVar268;
          fVar184 = auVar154._8_4_ * auVar167._8_4_;
          auVar44._8_4_ = fVar184;
          fVar185 = auVar154._12_4_ * auVar167._12_4_;
          auVar44._12_4_ = fVar185;
          fVar186 = auVar154._16_4_ * 0.0;
          auVar44._16_4_ = fVar186;
          fVar187 = auVar154._20_4_ * 0.0;
          auVar44._20_4_ = fVar187;
          fVar188 = auVar154._24_4_ * 0.0;
          auVar44._24_4_ = fVar188;
          auVar44._28_4_ = 0x3f800000;
          fVar115 = auVar11._0_4_ * auVar167._0_4_;
          fVar140 = auVar11._4_4_ * auVar167._4_4_;
          auVar45._4_4_ = fVar140;
          auVar45._0_4_ = fVar115;
          fVar142 = auVar11._8_4_ * auVar167._8_4_;
          auVar45._8_4_ = fVar142;
          fVar141 = auVar11._12_4_ * auVar167._12_4_;
          auVar45._12_4_ = fVar141;
          fVar143 = auVar11._16_4_ * 0.0;
          auVar45._16_4_ = fVar143;
          fVar145 = auVar11._20_4_ * 0.0;
          auVar45._20_4_ = fVar145;
          fVar147 = auVar11._24_4_ * 0.0;
          auVar45._24_4_ = fVar147;
          auVar45._28_4_ = auVar95._28_4_;
          auVar167 = vfmadd213ps_fma(local_3c0,auVar44,local_3e0);
          auVar148 = vfmadd213ps_fma(local_3c0,auVar45,local_3e0);
          auVar46._28_4_ = auVar154._28_4_;
          auVar46._0_28_ =
               ZEXT1628(CONCAT412(fVar144 * auVar167._12_4_,
                                  CONCAT48(fVar146 * auVar167._8_4_,
                                           CONCAT44(fVar139 * auVar167._4_4_,
                                                    fVar138 * auVar167._0_4_))));
          auVar154 = ZEXT1632(CONCAT412(fVar144 * auVar148._12_4_,
                                        CONCAT48(fVar146 * auVar148._8_4_,
                                                 CONCAT44(fVar139 * auVar148._4_4_,
                                                          fVar138 * auVar148._0_4_))));
          auVar167 = vfmadd213ps_fma(_local_6a0,auVar46,auVar175);
          auVar148 = vfmadd213ps_fma(_local_6a0,auVar154,auVar175);
          auVar117 = vfmadd213ps_fma(local_600,auVar46,auVar96);
          auVar81 = vfmadd213ps_fma(local_600,auVar154,auVar96);
          auVar118 = vfmadd213ps_fma(auVar46,local_5e0,local_5c0);
          auVar89 = vfmadd213ps_fma(local_5e0,auVar154,local_5c0);
          auVar47._4_4_ = fVar160 * (float)local_860._4_4_;
          auVar47._0_4_ = fVar268 * (float)local_860._0_4_;
          auVar47._8_4_ = fVar184 * fStack_858;
          auVar47._12_4_ = fVar185 * fStack_854;
          auVar47._16_4_ = fVar186 * fStack_850;
          auVar47._20_4_ = fVar187 * fStack_84c;
          auVar47._24_4_ = fVar188 * fStack_848;
          auVar47._28_4_ = 0;
          auVar154 = vsubps_avx(auVar47,ZEXT1632(auVar167));
          auVar181._0_4_ = (float)local_840._0_4_ * fVar268;
          auVar181._4_4_ = (float)local_840._4_4_ * fVar160;
          auVar181._8_4_ = fStack_838 * fVar184;
          auVar181._12_4_ = fStack_834 * fVar185;
          auVar181._16_4_ = fStack_830 * fVar186;
          auVar181._20_4_ = fStack_82c * fVar187;
          auVar181._24_4_ = fStack_828 * fVar188;
          auVar181._28_4_ = 0;
          auVar179 = vsubps_avx(auVar181,ZEXT1632(auVar117));
          auVar219._0_4_ = (float)local_9c0._0_4_ * fVar268;
          auVar219._4_4_ = (float)local_9c0._4_4_ * fVar160;
          auVar219._8_4_ = fStack_9b8 * fVar184;
          auVar219._12_4_ = fStack_9b4 * fVar185;
          auVar219._16_4_ = fStack_9b0 * fVar186;
          auVar219._20_4_ = fStack_9ac * fVar187;
          auVar219._24_4_ = fStack_9a8 * fVar188;
          auVar219._28_4_ = 0;
          auVar11 = vsubps_avx(auVar219,ZEXT1632(auVar118));
          auVar198 = auVar11._0_28_;
          auVar48._4_4_ = fVar140 * (float)local_860._4_4_;
          auVar48._0_4_ = fVar115 * (float)local_860._0_4_;
          auVar48._8_4_ = fVar142 * fStack_858;
          auVar48._12_4_ = fVar141 * fStack_854;
          auVar48._16_4_ = fVar143 * fStack_850;
          auVar48._20_4_ = fVar145 * fStack_84c;
          auVar48._24_4_ = fVar147 * fStack_848;
          auVar48._28_4_ = 0;
          local_8c0 = vsubps_avx(auVar48,ZEXT1632(auVar148));
          auVar49._4_4_ = (float)local_840._4_4_ * fVar140;
          auVar49._0_4_ = (float)local_840._0_4_ * fVar115;
          auVar49._8_4_ = fStack_838 * fVar142;
          auVar49._12_4_ = fStack_834 * fVar141;
          auVar49._16_4_ = fStack_830 * fVar143;
          auVar49._20_4_ = fStack_82c * fVar145;
          auVar49._24_4_ = fStack_828 * fVar147;
          auVar49._28_4_ = local_8c0._28_4_;
          local_8e0 = vsubps_avx(auVar49,ZEXT1632(auVar81));
          auVar50._4_4_ = (float)local_9c0._4_4_ * fVar140;
          auVar50._0_4_ = (float)local_9c0._0_4_ * fVar115;
          auVar50._8_4_ = fStack_9b8 * fVar142;
          auVar50._12_4_ = fStack_9b4 * fVar141;
          auVar50._16_4_ = fStack_9b0 * fVar143;
          auVar50._20_4_ = fStack_9ac * fVar145;
          auVar50._24_4_ = fStack_9a8 * fVar147;
          auVar50._28_4_ = local_8e0._28_4_;
          _local_680 = vsubps_avx(auVar50,ZEXT1632(auVar89));
          auVar11 = vcmpps_avx(auVar274,_DAT_01faff00,5);
          auVar220._8_4_ = 0x7f800000;
          auVar220._0_8_ = 0x7f8000007f800000;
          auVar220._12_4_ = 0x7f800000;
          auVar220._16_4_ = 0x7f800000;
          auVar220._20_4_ = 0x7f800000;
          auVar220._24_4_ = 0x7f800000;
          auVar220._28_4_ = 0x7f800000;
          auVar218 = vblendvps_avx(auVar220,auVar44,auVar11);
          auVar56._4_4_ = uStack_89c;
          auVar56._0_4_ = local_8a0;
          auVar56._8_4_ = uStack_898;
          auVar56._12_4_ = uStack_894;
          auVar56._16_4_ = uStack_890;
          auVar56._20_4_ = uStack_88c;
          auVar56._24_4_ = uStack_888;
          auVar56._28_4_ = uStack_884;
          auVar274 = vandps_avx(auVar56,local_620);
          auVar274 = vmaxps_avx(local_520,auVar274);
          auVar51._4_4_ = auVar274._4_4_ * 1.9073486e-06;
          auVar51._0_4_ = auVar274._0_4_ * 1.9073486e-06;
          auVar51._8_4_ = auVar274._8_4_ * 1.9073486e-06;
          auVar51._12_4_ = auVar274._12_4_ * 1.9073486e-06;
          auVar51._16_4_ = auVar274._16_4_ * 1.9073486e-06;
          auVar51._20_4_ = auVar274._20_4_ * 1.9073486e-06;
          auVar51._24_4_ = auVar274._24_4_ * 1.9073486e-06;
          auVar51._28_4_ = auVar274._28_4_;
          auVar274 = vandps_avx(auVar56,local_540);
          auVar274 = vcmpps_avx(auVar274,auVar51,1);
          auVar242 = ZEXT3264(auVar274);
          auVar225._8_4_ = 0xff800000;
          auVar225._0_8_ = 0xff800000ff800000;
          auVar225._12_4_ = 0xff800000;
          auVar225._16_4_ = 0xff800000;
          auVar225._20_4_ = 0xff800000;
          auVar225._24_4_ = 0xff800000;
          auVar225._28_4_ = 0xff800000;
          auVar224 = vblendvps_avx(auVar225,auVar45,auVar11);
          auVar12 = auVar11 & auVar274;
          if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar12 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar12 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar12 >> 0x7f,0) == '\0') &&
                (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar12 >> 0xbf,0) == '\0') &&
              (auVar12 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar12[0x1f]) {
            auVar251 = ZEXT3264(local_a00);
          }
          else {
            auVar274 = vandps_avx(auVar274,auVar11);
            auVar12 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
            auVar246 = ZEXT3264(auVar12);
            auVar262._8_4_ = 0xff800000;
            auVar262._0_8_ = 0xff800000ff800000;
            auVar262._12_4_ = 0xff800000;
            auVar262._16_4_ = 0xff800000;
            auVar262._20_4_ = 0xff800000;
            auVar262._24_4_ = 0xff800000;
            auVar262._28_4_ = 0xff800000;
            auVar266._8_4_ = 0x7f800000;
            auVar266._0_8_ = 0x7f8000007f800000;
            auVar266._12_4_ = 0x7f800000;
            auVar266._16_4_ = 0x7f800000;
            auVar266._20_4_ = 0x7f800000;
            auVar266._24_4_ = 0x7f800000;
            auVar266._28_4_ = 0x7f800000;
            auVar267 = ZEXT3264(auVar266);
            auVar98 = vblendvps_avx(auVar266,auVar262,auVar12);
            auVar167 = vpackssdw_avx(auVar274._0_16_,auVar274._16_16_);
            auVar13 = vpmovsxwd_avx2(auVar167);
            auVar242 = ZEXT3264(auVar13);
            auVar218 = vblendvps_avx(auVar218,auVar98,auVar13);
            auVar98 = vblendvps_avx(auVar262,auVar266,auVar12);
            auVar224 = vblendvps_avx(auVar224,auVar98,auVar13);
            auVar238._0_8_ = auVar274._0_8_ ^ 0xffffffffffffffff;
            auVar238._8_4_ = auVar274._8_4_ ^ 0xffffffff;
            auVar238._12_4_ = auVar274._12_4_ ^ 0xffffffff;
            auVar238._16_4_ = auVar274._16_4_ ^ 0xffffffff;
            auVar238._20_4_ = auVar274._20_4_ ^ 0xffffffff;
            auVar238._24_4_ = auVar274._24_4_ ^ 0xffffffff;
            auVar238._28_4_ = auVar274._28_4_ ^ 0xffffffff;
            auVar274 = vorps_avx(auVar12,auVar238);
            auVar274 = vandps_avx(auVar274,auVar11);
            auVar251 = ZEXT3264(auVar274);
          }
        }
        auVar239 = ZEXT3264(auVar95);
        auVar273 = local_9c0._0_28_;
        local_480 = _local_ac0;
        local_460 = vminps_avx(local_420,auVar218);
        local_440 = vmaxps_avx(_local_ac0,auVar224);
        auVar274 = vcmpps_avx(_local_ac0,local_460,2);
        local_5c0 = vandps_avx(auVar95,auVar274);
        auVar274 = vcmpps_avx(local_440,local_420,2);
        local_600 = vandps_avx(auVar95,auVar274);
        auVar95 = vorps_avx(local_600,local_5c0);
        auVar272 = ZEXT3264(local_a80);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0x7f,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0xbf,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0x1f] < '\0') {
          _local_6a0 = local_440;
          auVar274 = _local_6a0;
          local_620._0_8_ = auVar251._0_8_ ^ 0xffffffffffffffff;
          local_620._8_4_ = auVar251._8_4_ ^ 0xffffffff;
          local_620._12_4_ = auVar251._12_4_ ^ 0xffffffff;
          local_620._16_4_ = auVar251._16_4_ ^ 0xffffffff;
          local_620._20_4_ = auVar251._20_4_ ^ 0xffffffff;
          local_620._24_4_ = auVar251._24_4_ ^ 0xffffffff;
          local_620._28_4_ = auVar251._28_4_ ^ 0xffffffff;
          auVar52._4_4_ = (float)local_9c0._4_4_ * auVar198._4_4_;
          auVar52._0_4_ = (float)local_9c0._0_4_ * auVar198._0_4_;
          auVar52._8_4_ = fStack_9b8 * auVar198._8_4_;
          auVar52._12_4_ = fStack_9b4 * auVar198._12_4_;
          auVar52._16_4_ = fStack_9b0 * auVar198._16_4_;
          auVar52._20_4_ = fStack_9ac * auVar198._20_4_;
          auVar52._24_4_ = fStack_9a8 * auVar198._24_4_;
          auVar52._28_4_ = auVar95._28_4_;
          auVar167 = vfmadd213ps_fma(auVar179,_local_840,auVar52);
          auVar167 = vfmadd213ps_fma(auVar154,_local_860,ZEXT1632(auVar167));
          auVar57._4_4_ = uStack_89c;
          auVar57._0_4_ = local_8a0;
          auVar57._8_4_ = uStack_898;
          auVar57._12_4_ = uStack_894;
          auVar57._16_4_ = uStack_890;
          auVar57._20_4_ = uStack_88c;
          auVar57._24_4_ = uStack_888;
          auVar57._28_4_ = uStack_884;
          auVar95 = vandps_avx(ZEXT1632(auVar167),auVar57);
          auVar131._8_4_ = 0x3e99999a;
          auVar131._0_8_ = 0x3e99999a3e99999a;
          auVar131._12_4_ = 0x3e99999a;
          auVar131._16_4_ = 0x3e99999a;
          auVar131._20_4_ = 0x3e99999a;
          auVar131._24_4_ = 0x3e99999a;
          auVar131._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar131,1);
          auVar95 = vorps_avx(auVar95,local_620);
          auVar132._8_4_ = 3;
          auVar132._0_8_ = 0x300000003;
          auVar132._12_4_ = 3;
          auVar132._16_4_ = 3;
          auVar132._20_4_ = 3;
          auVar132._24_4_ = 3;
          auVar132._28_4_ = 3;
          auVar155._8_4_ = 2;
          auVar155._0_8_ = 0x200000002;
          auVar155._12_4_ = 2;
          auVar155._16_4_ = 2;
          auVar155._20_4_ = 2;
          auVar155._24_4_ = 2;
          auVar155._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar155,auVar132,auVar95);
          local_640._4_4_ = (float)local_c48;
          local_640._0_4_ = (float)local_c48;
          local_640._8_4_ = (float)local_c48;
          local_640._12_4_ = (float)local_c48;
          local_640._16_4_ = (float)local_c48;
          local_640._20_4_ = (float)local_c48;
          local_640._24_4_ = (float)local_c48;
          local_640._28_4_ = (float)local_c48;
          local_5e0 = vpcmpgtd_avx2(auVar95,local_640);
          local_5a0 = vpandn_avx2(local_5e0,local_5c0);
          auVar242 = ZEXT3264(local_5a0);
          auVar95 = local_5c0 & ~local_5e0;
          fStack_b2c = auVar8._4_4_;
          fStack_b28 = auVar8._8_4_;
          fStack_b24 = auVar8._12_4_;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
            auVar104._4_4_ = fVar234;
            auVar104._0_4_ = fVar234;
            auVar104._8_4_ = fVar234;
            auVar104._12_4_ = fVar234;
            auVar104._16_4_ = fVar234;
            auVar104._20_4_ = fVar234;
            auVar104._24_4_ = fVar234;
            auVar104._28_4_ = fVar234;
            local_6a0._0_4_ = local_440._0_4_;
            local_6a0._4_4_ = local_440._4_4_;
            fStack_698 = local_440._8_4_;
            fStack_694 = local_440._12_4_;
            fStack_690 = local_440._16_4_;
            fStack_68c = local_440._20_4_;
            fStack_688 = local_440._24_4_;
            fStack_684 = local_440._28_4_;
            fVar115 = (float)local_6a0._0_4_;
            fVar138 = (float)local_6a0._4_4_;
            fVar139 = fStack_698;
            fVar140 = fStack_694;
            fVar146 = fStack_690;
            fVar142 = fStack_68c;
            fVar144 = fStack_688;
            fVar141 = fStack_684;
            _local_6a0 = auVar274;
          }
          else {
            auVar148 = vminps_avx(auVar9,auVar82);
            auVar167 = vmaxps_avx(auVar9,auVar82);
            auVar117 = vminps_avx(auVar83,auVar8);
            auVar81 = vminps_avx(auVar148,auVar117);
            auVar148 = vmaxps_avx(auVar83,auVar8);
            auVar117 = vmaxps_avx(auVar167,auVar148);
            auVar167 = vandps_avx(auVar81,auVar226);
            auVar148 = vandps_avx(auVar117,auVar226);
            auVar167 = vmaxps_avx(auVar167,auVar148);
            auVar148 = vmovshdup_avx(auVar167);
            auVar148 = vmaxss_avx(auVar148,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar148);
            local_a00._0_4_ = auVar167._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar117,auVar117,0xff);
            local_880._4_4_ = (float)local_ac0._4_4_ + (float)local_980._4_4_;
            local_880._0_4_ = (float)local_ac0._0_4_ + (float)local_980._0_4_;
            fStack_878 = fStack_ab8 + fStack_978;
            fStack_874 = fStack_ab4 + fStack_974;
            fStack_870 = fStack_ab0 + fStack_970;
            fStack_86c = fStack_aac + fStack_96c;
            fStack_868 = fStack_aa8 + fStack_968;
            fStack_864 = fStack_aa4 + fStack_964;
            do {
              auVar105._8_4_ = 0x7f800000;
              auVar105._0_8_ = 0x7f8000007f800000;
              auVar105._12_4_ = 0x7f800000;
              auVar105._16_4_ = 0x7f800000;
              auVar105._20_4_ = 0x7f800000;
              auVar105._24_4_ = 0x7f800000;
              auVar105._28_4_ = 0x7f800000;
              auVar95 = auVar242._0_32_;
              auVar274 = vblendvps_avx(auVar105,_local_ac0,auVar95);
              auVar98 = vshufps_avx(auVar274,auVar274,0xb1);
              auVar98 = vminps_avx(auVar274,auVar98);
              auVar154 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar154);
              auVar154 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar154);
              auVar274 = vcmpps_avx(auVar274,auVar98,0);
              auVar98 = auVar95 & auVar274;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar274,auVar95);
              }
              uVar70 = vmovmskps_avx(auVar95);
              iVar16 = 0;
              for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar71 = iVar16 << 2;
              *(undefined4 *)(local_5a0 + uVar71) = 0;
              uVar70 = *(uint *)(local_1a0 + uVar71);
              uVar71 = *(uint *)(local_480 + uVar71);
              fVar115 = auVar5._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                auVar267 = ZEXT1664(auVar267._0_16_);
                fVar115 = sqrtf((float)local_9e0._0_4_);
              }
              local_7a0._0_4_ = fVar115 * 1.9073486e-06;
              auVar167 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar70),0x10);
              lVar75 = 5;
              do {
                auVar117 = vmovshdup_avx(auVar167);
                fVar146 = 1.0 - auVar117._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar146);
                auVar148 = vshufps_avx(auVar167,auVar167,0x55);
                fVar115 = auVar148._0_4_;
                auVar119._0_4_ = fVar112 * fVar115;
                fVar138 = auVar148._4_4_;
                auVar119._4_4_ = auVar82._4_4_ * fVar138;
                fVar139 = auVar148._8_4_;
                auVar119._8_4_ = auVar82._8_4_ * fVar139;
                fVar140 = auVar148._12_4_;
                auVar119._12_4_ = auVar82._12_4_ * fVar140;
                auVar149._4_4_ = fVar146;
                auVar149._0_4_ = fVar146;
                auVar149._8_4_ = fVar146;
                auVar149._12_4_ = fVar146;
                auVar148 = vfmadd231ps_fma(auVar119,auVar149,auVar9);
                auVar161._0_4_ = fVar113 * fVar115;
                auVar161._4_4_ = auVar83._4_4_ * fVar138;
                auVar161._8_4_ = auVar83._8_4_ * fVar139;
                auVar161._12_4_ = auVar83._12_4_ * fVar140;
                auVar81 = vfmadd231ps_fma(auVar161,auVar149,auVar82);
                auVar211._0_4_ = fVar115 * auVar81._0_4_;
                auVar211._4_4_ = fVar138 * auVar81._4_4_;
                auVar211._8_4_ = fVar139 * auVar81._8_4_;
                auVar211._12_4_ = fVar140 * auVar81._12_4_;
                auVar118 = vfmadd231ps_fma(auVar211,auVar149,auVar148);
                auVar120._0_4_ = fVar115 * fVar114;
                auVar120._4_4_ = fVar138 * fStack_b2c;
                auVar120._8_4_ = fVar139 * fStack_b28;
                auVar120._12_4_ = fVar140 * fStack_b24;
                auVar148 = vfmadd231ps_fma(auVar120,auVar149,auVar83);
                auVar192._0_4_ = fVar115 * auVar148._0_4_;
                auVar192._4_4_ = fVar138 * auVar148._4_4_;
                auVar192._8_4_ = fVar139 * auVar148._8_4_;
                auVar192._12_4_ = fVar140 * auVar148._12_4_;
                auVar81 = vfmadd231ps_fma(auVar192,auVar149,auVar81);
                fVar142 = auVar167._0_4_;
                auVar121._4_4_ = fVar142;
                auVar121._0_4_ = fVar142;
                auVar121._8_4_ = fVar142;
                auVar121._12_4_ = fVar142;
                auVar148 = vfmadd213ps_fma(auVar121,local_9d0,_DAT_01f7aa10);
                auVar84._0_4_ = fVar115 * auVar81._0_4_;
                auVar84._4_4_ = fVar138 * auVar81._4_4_;
                auVar84._8_4_ = fVar139 * auVar81._8_4_;
                auVar84._12_4_ = fVar140 * auVar81._12_4_;
                auVar89 = vfmadd231ps_fma(auVar84,auVar118,auVar149);
                local_780._0_16_ = auVar89;
                auVar148 = vsubps_avx(auVar148,auVar89);
                _local_960 = auVar148;
                auVar148 = vdpps_avx(auVar148,auVar148,0x7f);
                fVar115 = auVar148._0_4_;
                if (fVar115 < 0.0) {
                  local_aa0._0_16_ = ZEXT416((uint)fVar146);
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  auVar272._0_4_ = sqrtf(fVar115);
                  auVar272._4_60_ = extraout_var;
                  auVar89 = auVar272._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar148,auVar148);
                }
                auVar81 = vsubps_avx(auVar81,auVar118);
                auVar222._0_4_ = auVar81._0_4_ * 3.0;
                auVar222._4_4_ = auVar81._4_4_ * 3.0;
                auVar222._8_4_ = auVar81._8_4_ * 3.0;
                auVar222._12_4_ = auVar81._12_4_ * 3.0;
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_aa0._0_16_,auVar117);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar117,local_aa0._0_16_)
                ;
                fVar138 = local_aa0._0_4_ * 6.0;
                fVar139 = auVar81._0_4_ * 6.0;
                fVar140 = auVar118._0_4_ * 6.0;
                fVar146 = auVar117._0_4_ * 6.0;
                auVar162._0_4_ = fVar146 * fVar114;
                auVar162._4_4_ = fVar146 * fStack_b2c;
                auVar162._8_4_ = fVar146 * fStack_b28;
                auVar162._12_4_ = fVar146 * fStack_b24;
                auVar122._4_4_ = fVar140;
                auVar122._0_4_ = fVar140;
                auVar122._8_4_ = fVar140;
                auVar122._12_4_ = fVar140;
                auVar117 = vfmadd132ps_fma(auVar122,auVar162,auVar83);
                auVar163._4_4_ = fVar139;
                auVar163._0_4_ = fVar139;
                auVar163._8_4_ = fVar139;
                auVar163._12_4_ = fVar139;
                auVar117 = vfmadd132ps_fma(auVar163,auVar117,auVar82);
                auVar81 = vdpps_avx(auVar222,auVar222,0x7f);
                auVar123._4_4_ = fVar138;
                auVar123._0_4_ = fVar138;
                auVar123._8_4_ = fVar138;
                auVar123._12_4_ = fVar138;
                auVar191 = vfmadd132ps_fma(auVar123,auVar117,auVar9);
                auVar117 = vblendps_avx(auVar81,_DAT_01f7aa10,0xe);
                auVar118 = vrsqrtss_avx(auVar117,auVar117);
                fVar140 = auVar81._0_4_;
                fVar138 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar222,auVar191,0x7f);
                fVar138 = fVar138 * 1.5 + fVar140 * -0.5 * fVar138 * fVar138 * fVar138;
                auVar124._0_4_ = auVar191._0_4_ * fVar140;
                auVar124._4_4_ = auVar191._4_4_ * fVar140;
                auVar124._8_4_ = auVar191._8_4_ * fVar140;
                auVar124._12_4_ = auVar191._12_4_ * fVar140;
                fVar139 = auVar118._0_4_;
                auVar212._0_4_ = auVar222._0_4_ * fVar139;
                auVar212._4_4_ = auVar222._4_4_ * fVar139;
                auVar212._8_4_ = auVar222._8_4_ * fVar139;
                auVar212._12_4_ = auVar222._12_4_ * fVar139;
                auVar118 = vsubps_avx(auVar124,auVar212);
                auVar117 = vrcpss_avx(auVar117,auVar117);
                auVar191 = vfnmadd213ss_fma(auVar117,auVar81,ZEXT416(0x40000000));
                fVar139 = auVar117._0_4_ * auVar191._0_4_;
                auVar117 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar142 * (float)local_7a0._0_4_)));
                uVar17 = CONCAT44(auVar222._4_4_,auVar222._0_4_);
                auVar241._0_8_ = uVar17 ^ 0x8000000080000000;
                auVar241._8_4_ = -auVar222._8_4_;
                auVar241._12_4_ = -auVar222._12_4_;
                local_a40._0_4_ = fVar138 * auVar118._0_4_ * fVar139;
                local_a40._4_4_ = fVar138 * auVar118._4_4_ * fVar139;
                local_a40._8_4_ = fVar138 * auVar118._8_4_ * fVar139;
                local_a40._12_4_ = fVar138 * auVar118._12_4_ * fVar139;
                local_a20._0_4_ = auVar222._0_4_ * fVar138;
                local_a20._4_4_ = auVar222._4_4_ * fVar138;
                local_a20._8_4_ = auVar222._8_4_ * fVar138;
                local_a20._12_4_ = auVar222._12_4_ * fVar138;
                local_aa0._0_16_ = auVar222;
                if (fVar140 < -fVar140) {
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  fVar138 = sqrtf(fVar140);
                  auVar89 = ZEXT416(auVar89._0_4_);
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar138 = auVar81._0_4_;
                }
                auVar81 = vdpps_avx(_local_960,local_a20._0_16_,0x7f);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar89,
                                           ZEXT416((uint)auVar117._0_4_));
                auVar118 = vdpps_avx(auVar241,local_a20._0_16_,0x7f);
                auVar191 = vdpps_avx(_local_960,local_a40._0_16_,0x7f);
                auVar80 = vdpps_avx(local_9d0,local_a20._0_16_,0x7f);
                auVar207 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a00._0_4_ / fVar138)),
                                           auVar116);
                fVar139 = auVar81._0_4_;
                auVar85._0_4_ = fVar139 * fVar139;
                auVar85._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar85._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar85._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar89 = vdpps_avx(_local_960,auVar241,0x7f);
                auVar190 = vsubps_avx(auVar148,auVar85);
                auVar116 = vrsqrtss_avx(auVar190,auVar190);
                fVar140 = auVar190._0_4_;
                fVar138 = auVar116._0_4_;
                fVar138 = fVar138 * 1.5 + fVar140 * -0.5 * fVar138 * fVar138 * fVar138;
                auVar116 = vdpps_avx(_local_960,local_9d0,0x7f);
                local_a20._0_16_ = ZEXT416((uint)(auVar118._0_4_ + auVar191._0_4_));
                local_a40._0_16_ = vfnmadd231ss_fma(auVar89,auVar81,local_a20._0_16_);
                auVar118 = vfnmadd231ss_fma(auVar116,auVar81,auVar80);
                if (fVar140 < 0.0) {
                  local_7c0._0_16_ = auVar80;
                  local_7e0._0_4_ = fVar138;
                  local_800._0_16_ = auVar118;
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  fVar140 = sqrtf(fVar140);
                  fVar138 = (float)local_7e0._0_4_;
                  auVar118 = local_800._0_16_;
                  auVar80 = local_7c0._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar190,auVar190);
                  fVar140 = auVar89._0_4_;
                }
                auVar251 = ZEXT1664(auVar148);
                auVar273 = local_9c0._0_28_;
                auVar272 = ZEXT3264(local_a80);
                auVar246 = ZEXT1664(local_aa0._0_16_);
                auVar89 = vpermilps_avx(local_780._0_16_,0xff);
                fVar140 = fVar140 - auVar89._0_4_;
                auVar191 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar89 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar138),auVar191);
                auVar164._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
                auVar164._8_4_ = auVar80._8_4_ ^ 0x80000000;
                auVar164._12_4_ = auVar80._12_4_ ^ 0x80000000;
                auVar193._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar193._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar193._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar239 = ZEXT1664(local_a20._0_16_);
                auVar118 = ZEXT416((uint)(auVar118._0_4_ * fVar138));
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar80._0_4_ * auVar89._0_4_)),
                                          local_a20._0_16_,auVar118);
                auVar118 = vinsertps_avx(auVar193,auVar118,0x1c);
                uVar78 = auVar89._0_4_;
                auVar194._4_4_ = uVar78;
                auVar194._0_4_ = uVar78;
                auVar194._8_4_ = uVar78;
                auVar194._12_4_ = uVar78;
                auVar118 = vdivps_avx(auVar118,auVar194);
                auVar89 = vinsertps_avx(local_a20._0_16_,auVar164,0x10);
                auVar89 = vdivps_avx(auVar89,auVar194);
                auVar150._0_4_ = fVar139 * auVar118._0_4_ + fVar140 * auVar89._0_4_;
                auVar150._4_4_ = fVar139 * auVar118._4_4_ + fVar140 * auVar89._4_4_;
                auVar150._8_4_ = fVar139 * auVar118._8_4_ + fVar140 * auVar89._8_4_;
                auVar150._12_4_ = fVar139 * auVar118._12_4_ + fVar140 * auVar89._12_4_;
                auVar167 = vsubps_avx(auVar167,auVar150);
                auVar81 = vandps_avx(auVar81,auVar226);
                if (auVar81._0_4_ < auVar207._0_4_) {
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar207._0_4_ + auVar117._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar140),auVar226);
                  if (auVar117._0_4_ < auVar81._0_4_) {
                    fVar138 = auVar167._0_4_ + (float)local_910._0_4_;
                    auVar117 = ZEXT416((uint)fVar138);
                    if ((fVar77 <= fVar138) &&
                       (fVar139 = *(float *)(ray + k * 4 + 0x80), fVar138 <= fVar139)) {
                      auVar81 = vmovshdup_avx(auVar167);
                      fVar140 = auVar81._0_4_;
                      if ((0.0 <= fVar140) && (fVar140 <= 1.0)) {
                        auVar81 = vrsqrtss_avx(auVar148,auVar148);
                        fVar146 = auVar81._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar69].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar115 = fVar146 * 1.5 + fVar115 * -0.5 * fVar146 * fVar146 * fVar146;
                          auVar165._0_4_ = fVar115 * (float)local_960._0_4_;
                          auVar165._4_4_ = fVar115 * (float)local_960._4_4_;
                          auVar165._8_4_ = fVar115 * fStack_958;
                          auVar165._12_4_ = fVar115 * fStack_954;
                          auVar191 = vfmadd213ps_fma(auVar191,auVar165,local_aa0._0_16_);
                          auVar81 = vshufps_avx(auVar165,auVar165,0xc9);
                          auVar118 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                          auVar166._0_4_ = auVar165._0_4_ * auVar118._0_4_;
                          auVar166._4_4_ = auVar165._4_4_ * auVar118._4_4_;
                          auVar166._8_4_ = auVar165._8_4_ * auVar118._8_4_;
                          auVar166._12_4_ = auVar165._12_4_ * auVar118._12_4_;
                          auVar89 = vfmsub231ps_fma(auVar166,local_aa0._0_16_,auVar81);
                          auVar81 = vshufps_avx(auVar89,auVar89,0xc9);
                          auVar118 = vshufps_avx(auVar191,auVar191,0xc9);
                          auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                          auVar86._0_4_ = auVar191._0_4_ * auVar89._0_4_;
                          auVar86._4_4_ = auVar191._4_4_ * auVar89._4_4_;
                          auVar86._8_4_ = auVar191._8_4_ * auVar89._8_4_;
                          auVar86._12_4_ = auVar191._12_4_ * auVar89._12_4_;
                          auVar81 = vfmsub231ps_fma(auVar86,auVar81,auVar118);
                          uVar78 = auVar81._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar138;
                            uVar2 = vextractps_avx(auVar81,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar81,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar78;
                            *(float *)(ray + k * 4 + 0xf0) = fVar140;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(undefined4 *)(ray + k * 4 + 0x110) = local_9a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar69;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar167,auVar167,0x55);
                            auVar167 = vshufps_avx(auVar81,auVar81,0x55);
                            auStack_730 = vshufps_avx(auVar81,auVar81,0xaa);
                            local_740 = (RTCHitN  [16])auVar167;
                            local_720 = uVar78;
                            uStack_71c = uVar78;
                            uStack_718 = uVar78;
                            uStack_714 = uVar78;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar138;
                            local_940._0_16_ = *local_a48;
                            local_af0.valid = (int *)local_940;
                            local_af0.geometryUserPtr = pGVar3->userPtr;
                            local_af0.context = context->user;
                            local_af0.hit = local_740;
                            local_af0.N = 4;
                            auVar81 = *local_a48;
                            local_af0.ray = (RTCRayN *)ray;
                            if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar239 = ZEXT1664(local_a20._0_16_);
                              auVar246 = ZEXT1664(local_aa0._0_16_);
                              auVar251 = ZEXT1664(auVar148);
                              auVar267 = ZEXT1664(auVar267._0_16_);
                              (*pGVar3->intersectionFilterN)(&local_af0);
                              auVar135._8_56_ = extraout_var_01;
                              auVar135._0_8_ = extraout_XMM1_Qa;
                              auVar117 = auVar135._0_16_;
                              auVar272 = ZEXT3264(local_a80);
                              auVar81 = local_940._0_16_;
                            }
                            auVar273 = local_9c0._0_28_;
                            if (auVar81 == (undefined1  [16])0x0) {
                              auVar167 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar148 = vpcmpeqd_avx(auVar117,auVar117);
                              auVar167 = auVar167 ^ auVar148;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              auVar148 = vpcmpeqd_avx(auVar167,auVar167);
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar246 = ZEXT1664(auVar246._0_16_);
                                auVar251 = ZEXT1664(auVar251._0_16_);
                                auVar267 = ZEXT1664(auVar267._0_16_);
                                (*p_Var4)(&local_af0);
                                auVar272 = ZEXT3264(local_a80);
                                auVar273 = local_9c0._0_28_;
                                auVar148 = vpcmpeqd_avx(auVar148,auVar148);
                                auVar81 = local_940._0_16_;
                              }
                              auVar117 = vpcmpeqd_avx(auVar81,_DAT_01f7aa10);
                              auVar167 = auVar117 ^ auVar148;
                              if (auVar81 != (undefined1  [16])0x0) {
                                auVar117 = auVar117 ^ auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    local_af0.hit);
                                *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x10));
                                *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x20));
                                *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x30));
                                *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x40));
                                *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x50));
                                *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x60));
                                *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x70));
                                *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x80));
                                *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar148;
                              }
                            }
                            auVar87._8_8_ = 0x100000001;
                            auVar87._0_8_ = 0x100000001;
                            if ((auVar87 & auVar167) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar139;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar75 = lVar75 + -1;
              } while (lVar75 != 0);
              auVar274 = local_5a0;
              uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar104._4_4_ = uVar78;
              auVar104._0_4_ = uVar78;
              auVar104._8_4_ = uVar78;
              auVar104._12_4_ = uVar78;
              auVar104._16_4_ = uVar78;
              auVar104._20_4_ = uVar78;
              auVar104._24_4_ = uVar78;
              auVar104._28_4_ = uVar78;
              auVar95 = vcmpps_avx(_local_880,auVar104,2);
              local_5a0 = vandps_avx(auVar95,local_5a0);
              auVar242 = ZEXT3264(local_5a0);
              auVar274 = auVar274 & auVar95;
            } while ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar274 >> 0x7f,0) != '\0') ||
                       (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar274 >> 0xbf,0) != '\0') ||
                     (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar274[0x1f] < '\0');
            auVar242 = ZEXT3264(local_440);
            fVar115 = (float)local_6a0._0_4_;
            fVar138 = (float)local_6a0._4_4_;
            fVar139 = fStack_698;
            fVar140 = fStack_694;
            fVar146 = fStack_690;
            fVar142 = fStack_68c;
            fVar144 = fStack_688;
            fVar141 = fStack_684;
          }
          auVar136._0_4_ = auVar273._0_4_ * (float)local_680._0_4_;
          auVar136._4_4_ = auVar273._4_4_ * (float)local_680._4_4_;
          auVar136._8_4_ = auVar273._8_4_ * fStack_678;
          auVar136._12_4_ = auVar273._12_4_ * fStack_674;
          auVar136._16_4_ = auVar273._16_4_ * fStack_670;
          auVar136._20_4_ = auVar273._20_4_ * fStack_66c;
          auVar136._28_36_ = auVar242._28_36_;
          auVar136._24_4_ = auVar273._24_4_ * fStack_668;
          auVar167 = vfmadd213ps_fma(local_8e0,_local_840,auVar136._0_32_);
          auVar167 = vfmadd213ps_fma(local_8c0,_local_860,ZEXT1632(auVar167));
          auVar58._4_4_ = uStack_89c;
          auVar58._0_4_ = local_8a0;
          auVar58._8_4_ = uStack_898;
          auVar58._12_4_ = uStack_894;
          auVar58._16_4_ = uStack_890;
          auVar58._20_4_ = uStack_88c;
          auVar58._24_4_ = uStack_888;
          auVar58._28_4_ = uStack_884;
          auVar95 = vandps_avx(ZEXT1632(auVar167),auVar58);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar156,1);
          auVar274 = vorps_avx(auVar95,local_620);
          auVar157._0_4_ = fVar115 + (float)local_980._0_4_;
          auVar157._4_4_ = fVar138 + (float)local_980._4_4_;
          auVar157._8_4_ = fVar139 + fStack_978;
          auVar157._12_4_ = fVar140 + fStack_974;
          auVar157._16_4_ = fVar146 + fStack_970;
          auVar157._20_4_ = fVar142 + fStack_96c;
          auVar157._24_4_ = fVar144 + fStack_968;
          auVar157._28_4_ = fVar141 + fStack_964;
          auVar95 = vcmpps_avx(auVar157,auVar104,2);
          local_8c0 = vandps_avx(auVar95,local_600);
          auVar158._8_4_ = 3;
          auVar158._0_8_ = 0x300000003;
          auVar158._12_4_ = 3;
          auVar158._16_4_ = 3;
          auVar158._20_4_ = 3;
          auVar158._24_4_ = 3;
          auVar158._28_4_ = 3;
          auVar182._8_4_ = 2;
          auVar182._0_8_ = 0x200000002;
          auVar182._12_4_ = 2;
          auVar182._16_4_ = 2;
          auVar182._20_4_ = 2;
          auVar182._24_4_ = 2;
          auVar182._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar182,auVar158,auVar274);
          local_8e0 = vpcmpgtd_avx2(auVar95,local_640);
          auVar95 = vpandn_avx2(local_8e0,local_8c0);
          auVar274 = local_8c0 & ~local_8e0;
          local_940 = auVar95;
          if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar274 >> 0x7f,0) != '\0') ||
                (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar274 >> 0xbf,0) != '\0') ||
              (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar274[0x1f] < '\0') {
            auVar148 = vminps_avx(auVar9,auVar82);
            auVar167 = vmaxps_avx(auVar9,auVar82);
            auVar117 = vminps_avx(auVar83,auVar8);
            auVar81 = vminps_avx(auVar148,auVar117);
            auVar148 = vmaxps_avx(auVar83,auVar8);
            auVar117 = vmaxps_avx(auVar167,auVar148);
            auVar167 = vandps_avx(auVar81,auVar226);
            auVar148 = vandps_avx(auVar117,auVar226);
            auVar167 = vmaxps_avx(auVar167,auVar148);
            auVar148 = vmovshdup_avx(auVar167);
            auVar148 = vmaxss_avx(auVar148,auVar167);
            auVar167 = vshufpd_avx(auVar167,auVar167,1);
            auVar167 = vmaxss_avx(auVar167,auVar148);
            local_a00._0_4_ = auVar167._0_4_ * 1.9073486e-06;
            local_820 = vshufps_avx(auVar117,auVar117,0xff);
            local_880._4_4_ = (float)local_980._4_4_ + local_440._4_4_;
            local_880._0_4_ = (float)local_980._0_4_ + local_440._0_4_;
            fStack_878 = fStack_978 + local_440._8_4_;
            fStack_874 = fStack_974 + local_440._12_4_;
            fStack_870 = fStack_970 + local_440._16_4_;
            fStack_86c = fStack_96c + local_440._20_4_;
            fStack_868 = fStack_968 + local_440._24_4_;
            fStack_864 = fStack_964 + local_440._28_4_;
            _local_ac0 = local_440;
            do {
              auVar106._8_4_ = 0x7f800000;
              auVar106._0_8_ = 0x7f8000007f800000;
              auVar106._12_4_ = 0x7f800000;
              auVar106._16_4_ = 0x7f800000;
              auVar106._20_4_ = 0x7f800000;
              auVar106._24_4_ = 0x7f800000;
              auVar106._28_4_ = 0x7f800000;
              auVar274 = vblendvps_avx(auVar106,_local_ac0,auVar95);
              auVar98 = vshufps_avx(auVar274,auVar274,0xb1);
              auVar98 = vminps_avx(auVar274,auVar98);
              auVar154 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar154);
              auVar154 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar154);
              auVar98 = vcmpps_avx(auVar274,auVar98,0);
              auVar154 = auVar95 & auVar98;
              auVar274 = auVar95;
              if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar154 >> 0x7f,0) != '\0') ||
                    (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar154 >> 0xbf,0) != '\0') ||
                  (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar154[0x1f] < '\0') {
                auVar274 = vandps_avx(auVar98,auVar95);
              }
              uVar70 = vmovmskps_avx(auVar274);
              iVar16 = 0;
              for (; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
                iVar16 = iVar16 + 1;
              }
              uVar71 = iVar16 << 2;
              local_940 = auVar95;
              *(undefined4 *)(local_940 + uVar71) = 0;
              uVar70 = *(uint *)(local_1c0 + uVar71);
              uVar71 = *(uint *)(local_420 + uVar71);
              fVar115 = auVar7._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                auVar267 = ZEXT1664(auVar267._0_16_);
                fVar115 = sqrtf((float)local_9e0._0_4_);
              }
              local_7a0._0_4_ = fVar115 * 1.9073486e-06;
              auVar167 = vinsertps_avx(ZEXT416(uVar71),ZEXT416(uVar70),0x10);
              lVar75 = 5;
              do {
                auVar117 = vmovshdup_avx(auVar167);
                fVar146 = 1.0 - auVar117._0_4_;
                local_aa0._0_16_ = ZEXT416((uint)fVar146);
                auVar148 = vshufps_avx(auVar167,auVar167,0x55);
                fVar115 = auVar148._0_4_;
                auVar125._0_4_ = fVar112 * fVar115;
                fVar138 = auVar148._4_4_;
                auVar125._4_4_ = auVar82._4_4_ * fVar138;
                fVar139 = auVar148._8_4_;
                auVar125._8_4_ = auVar82._8_4_ * fVar139;
                fVar140 = auVar148._12_4_;
                auVar125._12_4_ = auVar82._12_4_ * fVar140;
                auVar151._4_4_ = fVar146;
                auVar151._0_4_ = fVar146;
                auVar151._8_4_ = fVar146;
                auVar151._12_4_ = fVar146;
                auVar148 = vfmadd231ps_fma(auVar125,auVar151,auVar9);
                auVar168._0_4_ = fVar113 * fVar115;
                auVar168._4_4_ = auVar83._4_4_ * fVar138;
                auVar168._8_4_ = auVar83._8_4_ * fVar139;
                auVar168._12_4_ = auVar83._12_4_ * fVar140;
                auVar81 = vfmadd231ps_fma(auVar168,auVar151,auVar82);
                auVar213._0_4_ = fVar115 * auVar81._0_4_;
                auVar213._4_4_ = fVar138 * auVar81._4_4_;
                auVar213._8_4_ = fVar139 * auVar81._8_4_;
                auVar213._12_4_ = fVar140 * auVar81._12_4_;
                auVar118 = vfmadd231ps_fma(auVar213,auVar151,auVar148);
                auVar126._0_4_ = fVar115 * fVar114;
                auVar126._4_4_ = fVar138 * fStack_b2c;
                auVar126._8_4_ = fVar139 * fStack_b28;
                auVar126._12_4_ = fVar140 * fStack_b24;
                auVar148 = vfmadd231ps_fma(auVar126,auVar151,auVar83);
                auVar195._0_4_ = fVar115 * auVar148._0_4_;
                auVar195._4_4_ = fVar138 * auVar148._4_4_;
                auVar195._8_4_ = fVar139 * auVar148._8_4_;
                auVar195._12_4_ = fVar140 * auVar148._12_4_;
                auVar81 = vfmadd231ps_fma(auVar195,auVar151,auVar81);
                fVar142 = auVar167._0_4_;
                auVar127._4_4_ = fVar142;
                auVar127._0_4_ = fVar142;
                auVar127._8_4_ = fVar142;
                auVar127._12_4_ = fVar142;
                auVar148 = vfmadd213ps_fma(auVar127,local_9d0,_DAT_01f7aa10);
                auVar88._0_4_ = fVar115 * auVar81._0_4_;
                auVar88._4_4_ = fVar138 * auVar81._4_4_;
                auVar88._8_4_ = fVar139 * auVar81._8_4_;
                auVar88._12_4_ = fVar140 * auVar81._12_4_;
                auVar89 = vfmadd231ps_fma(auVar88,auVar118,auVar151);
                local_780._0_16_ = auVar89;
                auVar148 = vsubps_avx(auVar148,auVar89);
                _local_960 = auVar148;
                auVar148 = vdpps_avx(auVar148,auVar148,0x7f);
                fVar115 = auVar148._0_4_;
                if (fVar115 < 0.0) {
                  local_aa0._0_16_ = ZEXT416((uint)fVar146);
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  auVar111._0_4_ = sqrtf(fVar115);
                  auVar111._4_60_ = extraout_var_00;
                  auVar89 = auVar111._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar148,auVar148);
                }
                auVar81 = vsubps_avx(auVar81,auVar118);
                auVar223._0_4_ = auVar81._0_4_ * 3.0;
                auVar223._4_4_ = auVar81._4_4_ * 3.0;
                auVar223._8_4_ = auVar81._8_4_ * 3.0;
                auVar223._12_4_ = auVar81._12_4_ * 3.0;
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_aa0._0_16_,auVar117);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar117,local_aa0._0_16_)
                ;
                fVar138 = local_aa0._0_4_ * 6.0;
                fVar139 = auVar81._0_4_ * 6.0;
                fVar140 = auVar118._0_4_ * 6.0;
                fVar146 = auVar117._0_4_ * 6.0;
                auVar169._0_4_ = fVar146 * fVar114;
                auVar169._4_4_ = fVar146 * fStack_b2c;
                auVar169._8_4_ = fVar146 * fStack_b28;
                auVar169._12_4_ = fVar146 * fStack_b24;
                auVar128._4_4_ = fVar140;
                auVar128._0_4_ = fVar140;
                auVar128._8_4_ = fVar140;
                auVar128._12_4_ = fVar140;
                auVar117 = vfmadd132ps_fma(auVar128,auVar169,auVar83);
                auVar170._4_4_ = fVar139;
                auVar170._0_4_ = fVar139;
                auVar170._8_4_ = fVar139;
                auVar170._12_4_ = fVar139;
                auVar117 = vfmadd132ps_fma(auVar170,auVar117,auVar82);
                auVar81 = vdpps_avx(auVar223,auVar223,0x7f);
                auVar129._4_4_ = fVar138;
                auVar129._0_4_ = fVar138;
                auVar129._8_4_ = fVar138;
                auVar129._12_4_ = fVar138;
                auVar191 = vfmadd132ps_fma(auVar129,auVar117,auVar9);
                auVar117 = vblendps_avx(auVar81,_DAT_01f7aa10,0xe);
                auVar118 = vrsqrtss_avx(auVar117,auVar117);
                fVar140 = auVar81._0_4_;
                fVar138 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar223,auVar191,0x7f);
                fVar138 = fVar138 * 1.5 + fVar140 * -0.5 * fVar138 * fVar138 * fVar138;
                auVar130._0_4_ = auVar191._0_4_ * fVar140;
                auVar130._4_4_ = auVar191._4_4_ * fVar140;
                auVar130._8_4_ = auVar191._8_4_ * fVar140;
                auVar130._12_4_ = auVar191._12_4_ * fVar140;
                fVar139 = auVar118._0_4_;
                auVar214._0_4_ = auVar223._0_4_ * fVar139;
                auVar214._4_4_ = auVar223._4_4_ * fVar139;
                auVar214._8_4_ = auVar223._8_4_ * fVar139;
                auVar214._12_4_ = auVar223._12_4_ * fVar139;
                auVar118 = vsubps_avx(auVar130,auVar214);
                auVar117 = vrcpss_avx(auVar117,auVar117);
                auVar191 = vfnmadd213ss_fma(auVar117,auVar81,ZEXT416(0x40000000));
                fVar139 = auVar117._0_4_ * auVar191._0_4_;
                auVar117 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar142 * (float)local_7a0._0_4_)));
                uVar17 = CONCAT44(auVar223._4_4_,auVar223._0_4_);
                auVar245._0_8_ = uVar17 ^ 0x8000000080000000;
                auVar245._8_4_ = -auVar223._8_4_;
                auVar245._12_4_ = -auVar223._12_4_;
                local_a40._0_4_ = fVar138 * auVar118._0_4_ * fVar139;
                local_a40._4_4_ = fVar138 * auVar118._4_4_ * fVar139;
                local_a40._8_4_ = fVar138 * auVar118._8_4_ * fVar139;
                local_a40._12_4_ = fVar138 * auVar118._12_4_ * fVar139;
                local_a20._0_4_ = auVar223._0_4_ * fVar138;
                local_a20._4_4_ = auVar223._4_4_ * fVar138;
                local_a20._8_4_ = auVar223._8_4_ * fVar138;
                local_a20._12_4_ = auVar223._12_4_ * fVar138;
                local_aa0._0_16_ = auVar223;
                if (fVar140 < -fVar140) {
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  fVar138 = sqrtf(fVar140);
                  auVar89 = ZEXT416(auVar89._0_4_);
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar138 = auVar81._0_4_;
                }
                auVar81 = vdpps_avx(_local_960,local_a20._0_16_,0x7f);
                auVar80 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar89,
                                          ZEXT416((uint)auVar117._0_4_));
                auVar118 = vdpps_avx(auVar245,local_a20._0_16_,0x7f);
                auVar191 = vdpps_avx(_local_960,local_a40._0_16_,0x7f);
                local_a20._0_16_ = vdpps_avx(local_9d0,local_a20._0_16_,0x7f);
                auVar80 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_a00._0_4_ / fVar138)),auVar80)
                ;
                fVar138 = auVar118._0_4_ + auVar191._0_4_;
                auVar239 = ZEXT464((uint)fVar138);
                fVar140 = auVar81._0_4_;
                auVar90._0_4_ = fVar140 * fVar140;
                auVar90._4_4_ = auVar81._4_4_ * auVar81._4_4_;
                auVar90._8_4_ = auVar81._8_4_ * auVar81._8_4_;
                auVar90._12_4_ = auVar81._12_4_ * auVar81._12_4_;
                auVar118 = vdpps_avx(_local_960,auVar245,0x7f);
                auVar191 = vsubps_avx(auVar148,auVar90);
                auVar89 = vrsqrtss_avx(auVar191,auVar191);
                fVar146 = auVar191._0_4_;
                fVar139 = auVar89._0_4_;
                fVar139 = fVar139 * 1.5 + fVar146 * -0.5 * fVar139 * fVar139 * fVar139;
                auVar89 = vdpps_avx(_local_960,local_9d0,0x7f);
                local_a40._0_16_ = vfnmadd231ss_fma(auVar118,auVar81,ZEXT416((uint)fVar138));
                auVar118 = vfnmadd231ss_fma(auVar89,auVar81,local_a20._0_16_);
                if (fVar146 < 0.0) {
                  local_7c0._0_16_ = ZEXT416((uint)fVar138);
                  local_7e0._0_4_ = fVar139;
                  local_800._0_16_ = auVar118;
                  auVar267 = ZEXT1664(auVar267._0_16_);
                  fVar138 = sqrtf(fVar146);
                  auVar239 = ZEXT1664(local_7c0._0_16_);
                  fVar139 = (float)local_7e0._0_4_;
                  auVar118 = local_800._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar191,auVar191);
                  fVar138 = auVar89._0_4_;
                }
                auVar251 = ZEXT1664(auVar148);
                auVar272 = ZEXT3264(local_a80);
                auVar246 = ZEXT1664(local_aa0._0_16_);
                auVar89 = vpermilps_avx(local_780._0_16_,0xff);
                fVar138 = fVar138 - auVar89._0_4_;
                auVar191 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xff);
                auVar89 = vfmsub213ss_fma(local_a40._0_16_,ZEXT416((uint)fVar139),auVar191);
                auVar171._0_8_ = local_a20._0_8_ ^ 0x8000000080000000;
                auVar171._8_4_ = local_a20._8_4_ ^ 0x80000000;
                auVar171._12_4_ = local_a20._12_4_ ^ 0x80000000;
                auVar196._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar196._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar196._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar118 = ZEXT416((uint)(auVar118._0_4_ * fVar139));
                auVar116 = auVar239._0_16_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar89._0_4_ * local_a20._0_4_)),auVar116,
                                          auVar118);
                auVar118 = vinsertps_avx(auVar196,auVar118,0x1c);
                uVar78 = auVar89._0_4_;
                auVar197._4_4_ = uVar78;
                auVar197._0_4_ = uVar78;
                auVar197._8_4_ = uVar78;
                auVar197._12_4_ = uVar78;
                auVar118 = vdivps_avx(auVar118,auVar197);
                auVar89 = vinsertps_avx(auVar116,auVar171,0x10);
                auVar89 = vdivps_avx(auVar89,auVar197);
                auVar152._0_4_ = fVar140 * auVar118._0_4_ + fVar138 * auVar89._0_4_;
                auVar152._4_4_ = fVar140 * auVar118._4_4_ + fVar138 * auVar89._4_4_;
                auVar152._8_4_ = fVar140 * auVar118._8_4_ + fVar138 * auVar89._8_4_;
                auVar152._12_4_ = fVar140 * auVar118._12_4_ + fVar138 * auVar89._12_4_;
                auVar167 = vsubps_avx(auVar167,auVar152);
                auVar81 = vandps_avx(auVar81,auVar226);
                if (auVar81._0_4_ < auVar80._0_4_) {
                  auVar81 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ + auVar117._0_4_)),
                                            local_820,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar138),auVar226);
                  if (auVar117._0_4_ < auVar81._0_4_) {
                    fVar138 = auVar167._0_4_ + (float)local_910._0_4_;
                    auVar117 = ZEXT416((uint)fVar138);
                    if ((fVar77 <= fVar138) &&
                       (fVar139 = *(float *)(ray + k * 4 + 0x80), fVar138 <= fVar139)) {
                      auVar81 = vmovshdup_avx(auVar167);
                      fVar140 = auVar81._0_4_;
                      if ((0.0 <= fVar140) && (fVar140 <= 1.0)) {
                        auVar81 = vrsqrtss_avx(auVar148,auVar148);
                        fVar146 = auVar81._0_4_;
                        pGVar3 = (context->scene->geometries).items[uVar69].ptr;
                        if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          fVar115 = fVar146 * 1.5 + fVar115 * -0.5 * fVar146 * fVar146 * fVar146;
                          auVar172._0_4_ = fVar115 * (float)local_960._0_4_;
                          auVar172._4_4_ = fVar115 * (float)local_960._4_4_;
                          auVar172._8_4_ = fVar115 * fStack_958;
                          auVar172._12_4_ = fVar115 * fStack_954;
                          auVar191 = vfmadd213ps_fma(auVar191,auVar172,local_aa0._0_16_);
                          auVar81 = vshufps_avx(auVar172,auVar172,0xc9);
                          auVar118 = vshufps_avx(local_aa0._0_16_,local_aa0._0_16_,0xc9);
                          auVar173._0_4_ = auVar172._0_4_ * auVar118._0_4_;
                          auVar173._4_4_ = auVar172._4_4_ * auVar118._4_4_;
                          auVar173._8_4_ = auVar172._8_4_ * auVar118._8_4_;
                          auVar173._12_4_ = auVar172._12_4_ * auVar118._12_4_;
                          auVar89 = vfmsub231ps_fma(auVar173,local_aa0._0_16_,auVar81);
                          auVar81 = vshufps_avx(auVar89,auVar89,0xc9);
                          auVar118 = vshufps_avx(auVar191,auVar191,0xc9);
                          auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                          auVar91._0_4_ = auVar191._0_4_ * auVar89._0_4_;
                          auVar91._4_4_ = auVar191._4_4_ * auVar89._4_4_;
                          auVar91._8_4_ = auVar191._8_4_ * auVar89._8_4_;
                          auVar91._12_4_ = auVar191._12_4_ * auVar89._12_4_;
                          auVar81 = vfmsub231ps_fma(auVar91,auVar81,auVar118);
                          uVar78 = auVar81._0_4_;
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar138;
                            uVar2 = vextractps_avx(auVar81,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar81,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(undefined4 *)(ray + k * 4 + 0xe0) = uVar78;
                            *(float *)(ray + k * 4 + 0xf0) = fVar140;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(undefined4 *)(ray + k * 4 + 0x110) = local_9a0;
                            *(uint *)(ray + k * 4 + 0x120) = uVar69;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_710 = vshufps_avx(auVar167,auVar167,0x55);
                            auVar167 = vshufps_avx(auVar81,auVar81,0x55);
                            auStack_730 = vshufps_avx(auVar81,auVar81,0xaa);
                            local_740 = (RTCHitN  [16])auVar167;
                            local_720 = uVar78;
                            uStack_71c = uVar78;
                            uStack_718 = uVar78;
                            uStack_714 = uVar78;
                            local_700 = ZEXT416(0) << 0x20;
                            local_6f0 = CONCAT44(uStack_75c,local_760);
                            uStack_6e8 = CONCAT44(uStack_754,uStack_758);
                            local_6e0._4_4_ = uStack_74c;
                            local_6e0._0_4_ = local_750;
                            local_6e0._8_4_ = uStack_748;
                            local_6e0._12_4_ = uStack_744;
                            vpcmpeqd_avx2(ZEXT1632(local_6e0),ZEXT1632(local_6e0));
                            uStack_6cc = context->user->instID[0];
                            local_6d0 = uStack_6cc;
                            uStack_6c8 = uStack_6cc;
                            uStack_6c4 = uStack_6cc;
                            uStack_6c0 = context->user->instPrimID[0];
                            uStack_6bc = uStack_6c0;
                            uStack_6b8 = uStack_6c0;
                            uStack_6b4 = uStack_6c0;
                            *(float *)(ray + k * 4 + 0x80) = fVar138;
                            local_900 = *local_a48;
                            local_af0.valid = (int *)local_900;
                            local_af0.geometryUserPtr = pGVar3->userPtr;
                            local_af0.context = context->user;
                            local_af0.hit = local_740;
                            local_af0.N = 4;
                            local_af0.ray = (RTCRayN *)ray;
                            if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar239 = ZEXT1664(auVar116);
                              auVar246 = ZEXT1664(local_aa0._0_16_);
                              auVar251 = ZEXT1664(auVar148);
                              auVar267 = ZEXT1664(auVar267._0_16_);
                              (*pGVar3->intersectionFilterN)(&local_af0);
                              auVar137._8_56_ = extraout_var_02;
                              auVar137._0_8_ = extraout_XMM1_Qa_00;
                              auVar117 = auVar137._0_16_;
                              auVar272 = ZEXT3264(local_a80);
                            }
                            if (local_900 == (undefined1  [16])0x0) {
                              auVar167 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar148 = vpcmpeqd_avx(auVar117,auVar117);
                              auVar167 = auVar167 ^ auVar148;
                            }
                            else {
                              p_Var4 = context->args->filter;
                              auVar148 = vpcmpeqd_avx(auVar167,auVar167);
                              if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar239 = ZEXT1664(auVar239._0_16_);
                                auVar246 = ZEXT1664(auVar246._0_16_);
                                auVar251 = ZEXT1664(auVar251._0_16_);
                                auVar267 = ZEXT1664(auVar267._0_16_);
                                (*p_Var4)(&local_af0);
                                auVar272 = ZEXT3264(local_a80);
                                auVar148 = vpcmpeqd_avx(auVar148,auVar148);
                              }
                              auVar117 = vpcmpeqd_avx(local_900,_DAT_01f7aa10);
                              auVar167 = auVar117 ^ auVar148;
                              if (local_900 != (undefined1  [16])0x0) {
                                auVar117 = auVar117 ^ auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    local_af0.hit);
                                *(undefined1 (*) [16])(local_af0.ray + 0xc0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x10));
                                *(undefined1 (*) [16])(local_af0.ray + 0xd0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x20));
                                *(undefined1 (*) [16])(local_af0.ray + 0xe0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x30));
                                *(undefined1 (*) [16])(local_af0.ray + 0xf0) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x40));
                                *(undefined1 (*) [16])(local_af0.ray + 0x100) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x50));
                                *(undefined1 (*) [16])(local_af0.ray + 0x110) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x60));
                                *(undefined1 (*) [16])(local_af0.ray + 0x120) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x70));
                                *(undefined1 (*) [16])(local_af0.ray + 0x130) = auVar148;
                                auVar148 = vmaskmovps_avx(auVar117,*(undefined1 (*) [16])
                                                                    (local_af0.hit + 0x80));
                                *(undefined1 (*) [16])(local_af0.ray + 0x140) = auVar148;
                              }
                            }
                            auVar92._8_8_ = 0x100000001;
                            auVar92._0_8_ = 0x100000001;
                            if ((auVar92 & auVar167) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar139;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar75 = lVar75 + -1;
              } while (lVar75 != 0);
              uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar104._4_4_ = uVar78;
              auVar104._0_4_ = uVar78;
              auVar104._8_4_ = uVar78;
              auVar104._12_4_ = uVar78;
              auVar104._16_4_ = uVar78;
              auVar104._20_4_ = uVar78;
              auVar104._24_4_ = uVar78;
              auVar104._28_4_ = uVar78;
              auVar274 = vcmpps_avx(_local_880,auVar104,2);
              auVar95 = vandps_avx(auVar274,local_940);
              auVar274 = local_940 & auVar274;
              local_940 = auVar95;
            } while ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar274 >> 0x7f,0) != '\0') ||
                       (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar274 >> 0xbf,0) != '\0') ||
                     (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar274[0x1f] < '\0');
          }
          auVar242 = ZEXT3264(local_440);
          auVar159._0_4_ = (float)local_980._0_4_ + local_480._0_4_;
          auVar159._4_4_ = (float)local_980._4_4_ + local_480._4_4_;
          auVar159._8_4_ = fStack_978 + local_480._8_4_;
          auVar159._12_4_ = fStack_974 + local_480._12_4_;
          auVar159._16_4_ = fStack_970 + local_480._16_4_;
          auVar159._20_4_ = fStack_96c + local_480._20_4_;
          auVar159._24_4_ = fStack_968 + local_480._24_4_;
          auVar159._28_4_ = fStack_964 + local_480._28_4_;
          auVar274 = vcmpps_avx(auVar159,auVar104,2);
          auVar95 = vandps_avx(local_5e0,local_5c0);
          auVar95 = vandps_avx(auVar274,auVar95);
          auVar183._0_4_ = local_440._0_4_ + (float)local_980._0_4_;
          auVar183._4_4_ = local_440._4_4_ + (float)local_980._4_4_;
          auVar183._8_4_ = local_440._8_4_ + fStack_978;
          auVar183._12_4_ = local_440._12_4_ + fStack_974;
          auVar183._16_4_ = local_440._16_4_ + fStack_970;
          auVar183._20_4_ = local_440._20_4_ + fStack_96c;
          auVar183._24_4_ = local_440._24_4_ + fStack_968;
          auVar183._28_4_ = local_440._28_4_ + fStack_964;
          auVar98 = vcmpps_avx(auVar183,auVar104,2);
          auVar274 = vandps_avx(local_8e0,local_8c0);
          auVar274 = vandps_avx(auVar98,auVar274);
          auVar274 = vorps_avx(auVar95,auVar274);
          if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar274 >> 0x7f,0) != '\0') ||
                (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar274 >> 0xbf,0) != '\0') ||
              (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar274[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar74 * 0x60) = auVar274;
            auVar95 = vblendvps_avx(local_440,local_480,auVar95);
            *(undefined1 (*) [32])(auStack_160 + uVar74 * 0x60) = auVar95;
            uVar79 = vmovlps_avx(local_550);
            (&uStack_140)[uVar74 * 0xc] = uVar79;
            aiStack_138[uVar74 * 0x18] = local_c48 + 1;
            iVar73 = iVar73 + 1;
          }
        }
      }
    }
    auVar274 = local_500;
    if (iVar73 == 0) break;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar107._4_4_ = uVar78;
    auVar107._0_4_ = uVar78;
    auVar107._8_4_ = uVar78;
    auVar107._12_4_ = uVar78;
    auVar107._16_4_ = uVar78;
    auVar107._20_4_ = uVar78;
    auVar107._24_4_ = uVar78;
    auVar107._28_4_ = uVar78;
    uVar70 = -iVar73;
    pauVar68 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar73 - 1) * 0x60);
    fVar115 = (float)local_980._0_4_;
    fVar138 = (float)local_980._4_4_;
    fVar139 = fStack_978;
    fVar140 = fStack_974;
    fVar146 = fStack_970;
    fVar142 = fStack_96c;
    fVar144 = fStack_968;
    fVar141 = fStack_964;
    while( true ) {
      auVar95 = pauVar68[1];
      auVar133._0_4_ = fVar115 + auVar95._0_4_;
      auVar133._4_4_ = fVar138 + auVar95._4_4_;
      auVar133._8_4_ = fVar139 + auVar95._8_4_;
      auVar133._12_4_ = fVar140 + auVar95._12_4_;
      auVar133._16_4_ = fVar146 + auVar95._16_4_;
      auVar133._20_4_ = fVar142 + auVar95._20_4_;
      auVar133._24_4_ = fVar144 + auVar95._24_4_;
      auVar133._28_4_ = fVar141 + auVar95._28_4_;
      auVar154 = vcmpps_avx(auVar133,auVar107,2);
      auVar98 = vandps_avx(auVar154,*pauVar68);
      _local_740 = auVar98;
      auVar154 = *pauVar68 & auVar154;
      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar154 >> 0x7f,0) != '\0') ||
            (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar154 >> 0xbf,0) != '\0') ||
          (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar154[0x1f] < '\0') break;
      pauVar68 = pauVar68 + -3;
      uVar70 = uVar70 + 1;
      fVar115 = (float)local_980._0_4_;
      fVar138 = (float)local_980._4_4_;
      fVar139 = fStack_978;
      fVar140 = fStack_974;
      fVar146 = fStack_970;
      fVar142 = fStack_96c;
      fVar144 = fStack_968;
      fVar141 = fStack_964;
      if (uVar70 == 0) goto LAB_0158d755;
    }
    auVar108._8_4_ = 0x7f800000;
    auVar108._0_8_ = 0x7f8000007f800000;
    auVar108._12_4_ = 0x7f800000;
    auVar108._16_4_ = 0x7f800000;
    auVar108._20_4_ = 0x7f800000;
    auVar108._24_4_ = 0x7f800000;
    auVar108._28_4_ = 0x7f800000;
    auVar95 = vblendvps_avx(auVar108,auVar95,auVar98);
    auVar154 = vshufps_avx(auVar95,auVar95,0xb1);
    auVar154 = vminps_avx(auVar95,auVar154);
    auVar11 = vshufpd_avx(auVar154,auVar154,5);
    auVar154 = vminps_avx(auVar154,auVar11);
    auVar11 = vpermpd_avx2(auVar154,0x4e);
    auVar154 = vminps_avx(auVar154,auVar11);
    auVar95 = vcmpps_avx(auVar95,auVar154,0);
    auVar154 = auVar98 & auVar95;
    if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar154 >> 0x7f,0) != '\0') ||
          (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar154 >> 0xbf,0) != '\0') ||
        (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar154[0x1f] < '\0') {
      auVar98 = vandps_avx(auVar95,auVar98);
    }
    uVar17 = *(ulong *)pauVar68[2];
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar17;
    uVar71 = vmovmskps_avx(auVar98);
    iVar73 = 0;
    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
      iVar73 = iVar73 + 1;
    }
    *(undefined4 *)(local_740 + (uint)(iVar73 << 2)) = 0;
    uVar71 = ~uVar70;
    if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_740 >> 0x7f,0) != '\0') ||
          (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_740 >> 0xbf,0) != '\0') ||
        (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_740[0x1f] < '\0') {
      uVar71 = -uVar70;
    }
    uVar74 = (ulong)uVar71;
    local_c48 = *(int *)(pauVar68[2] + 8);
    *pauVar68 = _local_740;
    uVar78 = (undefined4)uVar17;
    auVar134._4_4_ = uVar78;
    auVar134._0_4_ = uVar78;
    auVar134._8_4_ = uVar78;
    auVar134._12_4_ = uVar78;
    auVar134._16_4_ = uVar78;
    auVar134._20_4_ = uVar78;
    auVar134._24_4_ = uVar78;
    auVar134._28_4_ = uVar78;
    auVar167 = vmovshdup_avx(auVar93);
    auVar167 = vsubps_avx(auVar167,auVar93);
    auVar109._0_4_ = auVar167._0_4_;
    auVar109._4_4_ = auVar109._0_4_;
    auVar109._8_4_ = auVar109._0_4_;
    auVar109._12_4_ = auVar109._0_4_;
    auVar109._16_4_ = auVar109._0_4_;
    auVar109._20_4_ = auVar109._0_4_;
    auVar109._24_4_ = auVar109._0_4_;
    auVar109._28_4_ = auVar109._0_4_;
    auVar167 = vfmadd132ps_fma(auVar109,auVar134,_DAT_01faff20);
    local_480 = ZEXT1632(auVar167);
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_480 + (uint)(iVar73 << 2));
  } while( true );
LAB_0158d755:
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar78;
  auVar94._0_4_ = uVar78;
  auVar94._8_4_ = uVar78;
  auVar94._12_4_ = uVar78;
  auVar5 = vcmpps_avx(local_560,auVar94,2);
  uVar69 = vmovmskps_avx(auVar5);
  uVar69 = (uint)uVar76 & uVar69;
  if (uVar69 == 0) {
    return;
  }
  goto LAB_0158af95;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }